

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_h<embree::sse2::RibbonCurve1Intersector1<embree::HermiteCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  int iVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  RTCFilterFunctionN p_Var22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  int iVar53;
  ulong uVar54;
  long lVar55;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar56;
  int iVar57;
  undefined4 uVar58;
  ulong uVar59;
  RTCIntersectArguments *pRVar60;
  ulong uVar61;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar62;
  undefined1 auVar63 [8];
  long lVar64;
  long lVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  float fVar73;
  float fVar74;
  float fVar107;
  float fVar109;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar108;
  float fVar110;
  float fVar111;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar112;
  float fVar113;
  float fVar141;
  float fVar143;
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar142;
  float fVar144;
  float fVar145;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar146;
  float fVar156;
  float fVar157;
  vfloat4 v;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar158;
  float fVar174;
  float fVar176;
  vfloat4 v_1;
  undefined1 auVar160 [16];
  float fVar159;
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar181;
  float fVar189;
  float fVar190;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar213;
  float fVar214;
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar219;
  float fVar220;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar221;
  float fVar222;
  float fVar229;
  float fVar231;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar228 [16];
  float fVar234;
  float fVar238;
  float fVar239;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar246;
  float fVar247;
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar271;
  float fVar273;
  float fVar275;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  float fVar272;
  float fVar274;
  float fVar276;
  undefined1 auVar270 [16];
  float fVar277;
  float fVar278;
  float fVar287;
  float fVar289;
  float fVar290;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar288;
  undefined1 auVar286 [16];
  float fVar291;
  float fVar292;
  float fVar297;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar298;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined4 uVar304;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar305;
  undefined1 auVar303 [16];
  float fVar306;
  float fVar307;
  undefined4 uVar308;
  float fVar309;
  undefined4 uVar310;
  float fVar311;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_44c;
  float fStack_43c;
  undefined1 local_438 [8];
  undefined8 uStack_430;
  undefined1 local_428 [8];
  undefined8 uStack_420;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  RTCIntersectArguments *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  ulong local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  Precalculations *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  float local_240;
  float local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  uint local_228;
  Primitive *local_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  uint local_118;
  int local_114;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  float local_b8 [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98 [4];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 uVar105;
  undefined2 uVar106;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  
  PVar17 = prim[1];
  uVar54 = (ulong)(byte)PVar17;
  lVar23 = uVar54 * 0x25;
  pPVar8 = prim + lVar23 + 6;
  fVar157 = *(float *)(pPVar8 + 0xc);
  fVar158 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar157;
  fVar174 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar157;
  fVar176 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar157;
  fVar146 = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar156 = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar157 = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar304 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar62;
  auVar75._12_2_ = uVar106;
  auVar75._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar148._12_4_ = auVar75._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar62;
  auVar148._10_2_ = uVar106;
  auVar76._10_6_ = auVar148._10_6_;
  auVar76._8_2_ = uVar106;
  auVar76._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar28._4_8_ = auVar76._8_8_;
  auVar28._2_2_ = uVar106;
  auVar28._0_2_ = uVar106;
  fVar291 = (float)((int)sVar72 >> 8);
  fVar297 = (float)(auVar28._0_4_ >> 0x18);
  fVar299 = (float)(auVar76._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar62;
  auVar116._12_2_ = uVar106;
  auVar116._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar62;
  auVar115._10_2_ = uVar106;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar106;
  auVar114._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar29._4_8_ = auVar114._8_8_;
  auVar29._2_2_ = uVar106;
  auVar29._0_2_ = uVar106;
  fVar181 = (float)((int)sVar72 >> 8);
  fVar189 = (float)(auVar29._0_4_ >> 0x18);
  fVar190 = (float)(auVar114._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar62;
  auVar119._12_2_ = uVar106;
  auVar119._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar62;
  auVar118._10_2_ = uVar106;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar106;
  auVar117._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar30._4_8_ = auVar117._8_8_;
  auVar30._2_2_ = uVar106;
  auVar30._0_2_ = uVar106;
  fVar215 = (float)((int)sVar72 >> 8);
  fVar219 = (float)(auVar30._0_4_ >> 0x18);
  fVar220 = (float)(auVar117._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar62;
  auVar122._12_2_ = uVar106;
  auVar122._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar62;
  auVar121._10_2_ = uVar106;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = uVar106;
  auVar120._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar31._4_8_ = auVar120._8_8_;
  auVar31._2_2_ = uVar106;
  auVar31._0_2_ = uVar106;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar107 = (float)(auVar31._0_4_ >> 0x18);
  fVar109 = (float)(auVar120._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar62;
  auVar194._12_2_ = uVar106;
  auVar194._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar62;
  auVar193._10_2_ = uVar106;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar106;
  auVar192._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar32._4_8_ = auVar192._8_8_;
  auVar32._2_2_ = uVar106;
  auVar32._0_2_ = uVar106;
  fVar221 = (float)((int)sVar72 >> 8);
  fVar229 = (float)(auVar32._0_4_ >> 0x18);
  fVar231 = (float)(auVar192._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar54 + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar62;
  auVar197._12_2_ = uVar106;
  auVar197._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar62;
  auVar196._10_2_ = uVar106;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar106;
  auVar195._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar33._4_8_ = auVar195._8_8_;
  auVar33._2_2_ = uVar106;
  auVar33._0_2_ = uVar106;
  fVar240 = (float)((int)sVar72 >> 8);
  fVar246 = (float)(auVar33._0_4_ >> 0x18);
  fVar247 = (float)(auVar195._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar62;
  auVar200._12_2_ = uVar106;
  auVar200._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar62;
  auVar199._10_2_ = uVar106;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar106;
  auVar198._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar34._4_8_ = auVar198._8_8_;
  auVar34._2_2_ = uVar106;
  auVar34._0_2_ = uVar106;
  fVar234 = (float)((int)sVar72 >> 8);
  fVar238 = (float)(auVar34._0_4_ >> 0x18);
  fVar239 = (float)(auVar198._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar62;
  auVar203._12_2_ = uVar106;
  auVar203._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar62;
  auVar202._10_2_ = uVar106;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar106;
  auVar201._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar35._4_8_ = auVar201._8_8_;
  auVar35._2_2_ = uVar106;
  auVar35._0_2_ = uVar106;
  fVar248 = (float)((int)sVar72 >> 8);
  fVar255 = (float)(auVar35._0_4_ >> 0x18);
  fVar258 = (float)(auVar201._8_4_ >> 0x18);
  uVar304 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar105 = (undefined1)((uint)uVar304 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar304 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar304));
  uVar105 = (undefined1)((uint)uVar304 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar105),uVar105);
  sVar72 = CONCAT11((char)uVar304,(char)uVar304);
  uVar62 = CONCAT62(uVar27,sVar72);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar62;
  auVar206._12_2_ = uVar106;
  auVar206._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar62;
  auVar205._10_2_ = uVar106;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar106;
  auVar204._0_8_ = uVar62;
  uVar106 = (undefined2)uVar27;
  auVar36._4_8_ = auVar204._8_8_;
  auVar36._2_2_ = uVar106;
  auVar36._0_2_ = uVar106;
  fVar112 = (float)((int)sVar72 >> 8);
  fVar141 = (float)(auVar36._0_4_ >> 0x18);
  fVar143 = (float)(auVar204._8_4_ >> 0x18);
  fVar277 = fVar146 * fVar291 + fVar156 * fVar181 + fVar157 * fVar215;
  fVar287 = fVar146 * fVar297 + fVar156 * fVar189 + fVar157 * fVar219;
  fVar289 = fVar146 * fVar299 + fVar156 * fVar190 + fVar157 * fVar220;
  fVar290 = fVar146 * (float)(auVar148._12_4_ >> 0x18) +
            fVar156 * (float)(auVar115._12_4_ >> 0x18) + fVar157 * (float)(auVar118._12_4_ >> 0x18);
  fVar263 = fVar146 * fVar73 + fVar156 * fVar221 + fVar157 * fVar240;
  fVar271 = fVar146 * fVar107 + fVar156 * fVar229 + fVar157 * fVar246;
  fVar273 = fVar146 * fVar109 + fVar156 * fVar231 + fVar157 * fVar247;
  fVar275 = fVar146 * (float)(auVar121._12_4_ >> 0x18) +
            fVar156 * (float)(auVar193._12_4_ >> 0x18) + fVar157 * (float)(auVar196._12_4_ >> 0x18);
  fVar191 = fVar146 * fVar234 + fVar156 * fVar248 + fVar157 * fVar112;
  fVar213 = fVar146 * fVar238 + fVar156 * fVar255 + fVar157 * fVar141;
  fVar214 = fVar146 * fVar239 + fVar156 * fVar258 + fVar157 * fVar143;
  fVar146 = fVar146 * (float)(auVar199._12_4_ >> 0x18) +
            fVar156 * (float)(auVar202._12_4_ >> 0x18) + fVar157 * (float)(auVar205._12_4_ >> 0x18);
  fVar292 = fVar291 * fVar158 + fVar181 * fVar174 + fVar215 * fVar176;
  fVar297 = fVar297 * fVar158 + fVar189 * fVar174 + fVar219 * fVar176;
  fVar299 = fVar299 * fVar158 + fVar190 * fVar174 + fVar220 * fVar176;
  fVar300 = (float)(auVar148._12_4_ >> 0x18) * fVar158 +
            (float)(auVar115._12_4_ >> 0x18) * fVar174 + (float)(auVar118._12_4_ >> 0x18) * fVar176;
  fVar240 = fVar73 * fVar158 + fVar221 * fVar174 + fVar240 * fVar176;
  fVar246 = fVar107 * fVar158 + fVar229 * fVar174 + fVar246 * fVar176;
  fVar247 = fVar109 * fVar158 + fVar231 * fVar174 + fVar247 * fVar176;
  fVar291 = (float)(auVar121._12_4_ >> 0x18) * fVar158 +
            (float)(auVar193._12_4_ >> 0x18) * fVar174 + (float)(auVar196._12_4_ >> 0x18) * fVar176;
  fVar234 = fVar158 * fVar234 + fVar174 * fVar248 + fVar176 * fVar112;
  fVar238 = fVar158 * fVar238 + fVar174 * fVar255 + fVar176 * fVar141;
  fVar239 = fVar158 * fVar239 + fVar174 * fVar258 + fVar176 * fVar143;
  fVar248 = fVar158 * (float)(auVar199._12_4_ >> 0x18) +
            fVar174 * (float)(auVar202._12_4_ >> 0x18) + fVar176 * (float)(auVar205._12_4_ >> 0x18);
  fVar157 = (float)DAT_01ff1d40;
  fVar73 = DAT_01ff1d40._4_4_;
  fVar107 = DAT_01ff1d40._8_4_;
  fVar109 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar157 <= ABS(fVar277));
  uVar67 = -(uint)(fVar73 <= ABS(fVar287));
  uVar68 = -(uint)(fVar107 <= ABS(fVar289));
  uVar69 = -(uint)(fVar109 <= ABS(fVar290));
  auVar279._0_4_ = (uint)fVar277 & uVar66;
  auVar279._4_4_ = (uint)fVar287 & uVar67;
  auVar279._8_4_ = (uint)fVar289 & uVar68;
  auVar279._12_4_ = (uint)fVar290 & uVar69;
  auVar160._0_4_ = ~uVar66 & (uint)fVar157;
  auVar160._4_4_ = ~uVar67 & (uint)fVar73;
  auVar160._8_4_ = ~uVar68 & (uint)fVar107;
  auVar160._12_4_ = ~uVar69 & (uint)fVar109;
  auVar160 = auVar160 | auVar279;
  uVar66 = -(uint)(fVar157 <= ABS(fVar263));
  uVar67 = -(uint)(fVar73 <= ABS(fVar271));
  uVar68 = -(uint)(fVar107 <= ABS(fVar273));
  uVar69 = -(uint)(fVar109 <= ABS(fVar275));
  auVar265._0_4_ = (uint)fVar263 & uVar66;
  auVar265._4_4_ = (uint)fVar271 & uVar67;
  auVar265._8_4_ = (uint)fVar273 & uVar68;
  auVar265._12_4_ = (uint)fVar275 & uVar69;
  auVar216._0_4_ = ~uVar66 & (uint)fVar157;
  auVar216._4_4_ = ~uVar67 & (uint)fVar73;
  auVar216._8_4_ = ~uVar68 & (uint)fVar107;
  auVar216._12_4_ = ~uVar69 & (uint)fVar109;
  auVar216 = auVar216 | auVar265;
  uVar66 = -(uint)(fVar157 <= ABS(fVar191));
  uVar67 = -(uint)(fVar73 <= ABS(fVar213));
  uVar68 = -(uint)(fVar107 <= ABS(fVar214));
  uVar69 = -(uint)(fVar109 <= ABS(fVar146));
  auVar207._0_4_ = (uint)fVar191 & uVar66;
  auVar207._4_4_ = (uint)fVar213 & uVar67;
  auVar207._8_4_ = (uint)fVar214 & uVar68;
  auVar207._12_4_ = (uint)fVar146 & uVar69;
  auVar223._0_4_ = ~uVar66 & (uint)fVar157;
  auVar223._4_4_ = ~uVar67 & (uint)fVar73;
  auVar223._8_4_ = ~uVar68 & (uint)fVar107;
  auVar223._12_4_ = ~uVar69 & (uint)fVar109;
  auVar223 = auVar223 | auVar207;
  auVar76 = rcpps(_DAT_01ff1d40,auVar160);
  fVar157 = auVar76._0_4_;
  fVar109 = auVar76._4_4_;
  fVar181 = auVar76._8_4_;
  fVar221 = auVar76._12_4_;
  fVar157 = (1.0 - auVar160._0_4_ * fVar157) * fVar157 + fVar157;
  fVar109 = (1.0 - auVar160._4_4_ * fVar109) * fVar109 + fVar109;
  fVar181 = (1.0 - auVar160._8_4_ * fVar181) * fVar181 + fVar181;
  fVar221 = (1.0 - auVar160._12_4_ * fVar221) * fVar221 + fVar221;
  auVar76 = rcpps(auVar76,auVar216);
  fVar73 = auVar76._0_4_;
  fVar112 = auVar76._4_4_;
  fVar189 = auVar76._8_4_;
  fVar229 = auVar76._12_4_;
  fVar73 = (1.0 - auVar216._0_4_ * fVar73) * fVar73 + fVar73;
  fVar112 = (1.0 - auVar216._4_4_ * fVar112) * fVar112 + fVar112;
  fVar189 = (1.0 - auVar216._8_4_ * fVar189) * fVar189 + fVar189;
  fVar229 = (1.0 - auVar216._12_4_ * fVar229) * fVar229 + fVar229;
  auVar76 = rcpps(auVar76,auVar223);
  fVar107 = auVar76._0_4_;
  fVar141 = auVar76._4_4_;
  fVar190 = auVar76._8_4_;
  fVar231 = auVar76._12_4_;
  fVar107 = (1.0 - auVar223._0_4_ * fVar107) * fVar107 + fVar107;
  fVar141 = (1.0 - auVar223._4_4_ * fVar141) * fVar141 + fVar141;
  fVar190 = (1.0 - auVar223._8_4_ * fVar190) * fVar190 + fVar190;
  fVar231 = (1.0 - auVar223._12_4_ * fVar231) * fVar231 + fVar231;
  fVar255 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar62 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar106 = (undefined2)(uVar62 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar62;
  auVar79._12_2_ = uVar106;
  auVar79._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar62 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar62;
  auVar78._10_2_ = uVar106;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar106;
  auVar77._0_8_ = uVar62;
  uVar106 = (undefined2)(uVar62 >> 0x10);
  auVar37._4_8_ = auVar77._8_8_;
  auVar37._2_2_ = uVar106;
  auVar37._0_2_ = uVar106;
  fVar143 = (float)(auVar37._0_4_ >> 0x10);
  fVar191 = (float)(auVar77._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar106 = (undefined2)(uVar61 >> 0x30);
  auVar163._8_4_ = 0;
  auVar163._0_8_ = uVar61;
  auVar163._12_2_ = uVar106;
  auVar163._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar61 >> 0x20);
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._8_2_ = 0;
  auVar162._0_8_ = uVar61;
  auVar162._10_2_ = uVar106;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = uVar106;
  auVar161._0_8_ = uVar61;
  uVar106 = (undefined2)(uVar61 >> 0x10);
  auVar38._4_8_ = auVar161._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  uVar9 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar106 = (undefined2)(uVar9 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar9;
  auVar82._12_2_ = uVar106;
  auVar82._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar9 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar9;
  auVar81._10_2_ = uVar106;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar106;
  auVar80._0_8_ = uVar9;
  uVar106 = (undefined2)(uVar9 >> 0x10);
  auVar39._4_8_ = auVar80._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  fVar146 = (float)(auVar39._0_4_ >> 0x10);
  fVar213 = (float)(auVar80._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar106 = (undefined2)(uVar10 >> 0x30);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar10;
  auVar226._12_2_ = uVar106;
  auVar226._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar10 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar10;
  auVar225._10_2_ = uVar106;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar106;
  auVar224._0_8_ = uVar10;
  uVar106 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar224._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  uVar11 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar106 = (undefined2)(uVar11 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar11;
  auVar85._12_2_ = uVar106;
  auVar85._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar11 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar11;
  auVar84._10_2_ = uVar106;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar106;
  auVar83._0_8_ = uVar11;
  uVar106 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar83._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  fVar156 = (float)(auVar41._0_4_ >> 0x10);
  fVar214 = (float)(auVar83._8_4_ >> 0x10);
  uVar59 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar54 * 2 + uVar59 + 6);
  uVar106 = (undefined2)(uVar12 >> 0x30);
  auVar243._8_4_ = 0;
  auVar243._0_8_ = uVar12;
  auVar243._12_2_ = uVar106;
  auVar243._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar12 >> 0x20);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._8_2_ = 0;
  auVar242._0_8_ = uVar12;
  auVar242._10_2_ = uVar106;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = uVar106;
  auVar241._0_8_ = uVar12;
  uVar106 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar241._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  uVar59 = *(ulong *)(prim + uVar59 + 6);
  uVar106 = (undefined2)(uVar59 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar59;
  auVar88._12_2_ = uVar106;
  auVar88._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar59 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar59;
  auVar87._10_2_ = uVar106;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar106;
  auVar86._0_8_ = uVar59;
  uVar106 = (undefined2)(uVar59 >> 0x10);
  auVar43._4_8_ = auVar86._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  fVar158 = (float)(auVar43._0_4_ >> 0x10);
  fVar215 = (float)(auVar86._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar106 = (undefined2)(uVar13 >> 0x30);
  auVar253._8_4_ = 0;
  auVar253._0_8_ = uVar13;
  auVar253._12_2_ = uVar106;
  auVar253._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar13 >> 0x20);
  auVar252._12_4_ = auVar253._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar13;
  auVar252._10_2_ = uVar106;
  auVar251._10_6_ = auVar252._10_6_;
  auVar251._8_2_ = uVar106;
  auVar251._0_8_ = uVar13;
  uVar106 = (undefined2)(uVar13 >> 0x10);
  auVar44._4_8_ = auVar251._8_8_;
  auVar44._2_2_ = uVar106;
  auVar44._0_2_ = uVar106;
  uVar14 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar106 = (undefined2)(uVar14 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar14;
  auVar91._12_2_ = uVar106;
  auVar91._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar14 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar14;
  auVar90._10_2_ = uVar106;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar106;
  auVar89._0_8_ = uVar14;
  uVar106 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar89._8_8_;
  auVar45._2_2_ = uVar106;
  auVar45._0_2_ = uVar106;
  fVar174 = (float)(auVar45._0_4_ >> 0x10);
  fVar219 = (float)(auVar89._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar106 = (undefined2)(uVar15 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar15;
  auVar268._12_2_ = uVar106;
  auVar268._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar15 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar15;
  auVar267._10_2_ = uVar106;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar106;
  auVar266._0_8_ = uVar15;
  uVar106 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar266._8_8_;
  auVar46._2_2_ = uVar106;
  auVar46._0_2_ = uVar106;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar54) + 6);
  uVar106 = (undefined2)(uVar16 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar16;
  auVar94._12_2_ = uVar106;
  auVar94._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar16 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar16;
  auVar93._10_2_ = uVar106;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar106;
  auVar92._0_8_ = uVar16;
  uVar106 = (undefined2)(uVar16 >> 0x10);
  auVar47._4_8_ = auVar92._8_8_;
  auVar47._2_2_ = uVar106;
  auVar47._0_2_ = uVar106;
  fVar176 = (float)(auVar47._0_4_ >> 0x10);
  fVar220 = (float)(auVar92._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar106 = (undefined2)(uVar54 >> 0x30);
  auVar282._8_4_ = 0;
  auVar282._0_8_ = uVar54;
  auVar282._12_2_ = uVar106;
  auVar282._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar54 >> 0x20);
  auVar281._12_4_ = auVar282._12_4_;
  auVar281._8_2_ = 0;
  auVar281._0_8_ = uVar54;
  auVar281._10_2_ = uVar106;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280._8_2_ = uVar106;
  auVar280._0_8_ = uVar54;
  uVar106 = (undefined2)(uVar54 >> 0x10);
  auVar48._4_8_ = auVar280._8_8_;
  auVar48._2_2_ = uVar106;
  auVar48._0_2_ = uVar106;
  auVar164._0_8_ =
       CONCAT44(((((float)(auVar38._0_4_ >> 0x10) - fVar143) * fVar255 + fVar143) - fVar297) *
                fVar109,((((float)(int)(short)uVar61 - (float)(int)(short)uVar62) * fVar255 +
                         (float)(int)(short)uVar62) - fVar292) * fVar157);
  auVar164._8_4_ =
       ((((float)(auVar161._8_4_ >> 0x10) - fVar191) * fVar255 + fVar191) - fVar299) * fVar181;
  auVar164._12_4_ =
       ((((float)(auVar162._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar255 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar300) * fVar221;
  auVar227._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar255 + (float)(int)(short)uVar9
        ) - fVar292) * fVar157;
  auVar227._4_4_ =
       ((((float)(auVar40._0_4_ >> 0x10) - fVar146) * fVar255 + fVar146) - fVar297) * fVar109;
  auVar227._8_4_ =
       ((((float)(auVar224._8_4_ >> 0x10) - fVar213) * fVar255 + fVar213) - fVar299) * fVar181;
  auVar227._12_4_ =
       ((((float)(auVar225._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar255 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar300) * fVar221;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar156) * fVar255 + fVar156) - fVar246) *
                fVar112,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar255 +
                         (float)(int)(short)uVar11) - fVar240) * fVar73);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - fVar214) * fVar255 + fVar214) - fVar247) * fVar189;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar255 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar291) * fVar229;
  auVar254._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar59) * fVar255 +
        (float)(int)(short)uVar59) - fVar240) * fVar73;
  auVar254._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar158) * fVar255 + fVar158) - fVar246) * fVar112;
  auVar254._8_4_ =
       ((((float)(auVar251._8_4_ >> 0x10) - fVar215) * fVar255 + fVar215) - fVar247) * fVar189;
  auVar254._12_4_ =
       ((((float)(auVar252._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar255 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar291) * fVar229;
  auVar269._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar174) * fVar255 + fVar174) - fVar238) *
                fVar141,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar255 +
                         (float)(int)(short)uVar14) - fVar234) * fVar107);
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar219) * fVar255 + fVar219) - fVar239) * fVar190;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar255 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar248) * fVar231;
  auVar283._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar16) * fVar255 +
        (float)(int)(short)uVar16) - fVar234) * fVar107;
  auVar283._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar176) * fVar255 + fVar176) - fVar238) * fVar141;
  auVar283._8_4_ =
       ((((float)(auVar280._8_4_ >> 0x10) - fVar220) * fVar255 + fVar220) - fVar239) * fVar190;
  auVar283._12_4_ =
       ((((float)(auVar281._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar255 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar248) * fVar231;
  auVar147._8_4_ = auVar164._8_4_;
  auVar147._0_8_ = auVar164._0_8_;
  auVar147._12_4_ = auVar164._12_4_;
  auVar148 = minps(auVar147,auVar227);
  auVar95._8_4_ = auVar244._8_4_;
  auVar95._0_8_ = auVar244._0_8_;
  auVar95._12_4_ = auVar244._12_4_;
  auVar76 = minps(auVar95,auVar254);
  auVar148 = maxps(auVar148,auVar76);
  auVar96._8_4_ = auVar269._8_4_;
  auVar96._0_8_ = auVar269._0_8_;
  auVar96._12_4_ = auVar269._12_4_;
  auVar76 = minps(auVar96,auVar283);
  uVar304 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar123._4_4_ = uVar304;
  auVar123._0_4_ = uVar304;
  auVar123._8_4_ = uVar304;
  auVar123._12_4_ = uVar304;
  auVar76 = maxps(auVar76,auVar123);
  auVar76 = maxps(auVar148,auVar76);
  local_48 = auVar76._0_4_ * 0.99999964;
  fStack_44 = auVar76._4_4_ * 0.99999964;
  fStack_40 = auVar76._8_4_ * 0.99999964;
  fStack_3c = auVar76._12_4_ * 0.99999964;
  auVar76 = maxps(auVar164,auVar227);
  auVar148 = maxps(auVar244,auVar254);
  auVar76 = minps(auVar76,auVar148);
  auVar148 = maxps(auVar269,auVar283);
  fVar157 = (ray->super_RayK<1>).tfar;
  auVar97._4_4_ = fVar157;
  auVar97._0_4_ = fVar157;
  auVar97._8_4_ = fVar157;
  auVar97._12_4_ = fVar157;
  auVar148 = minps(auVar148,auVar97);
  auVar76 = minps(auVar76,auVar148);
  uVar66 = (uint)(byte)PVar17;
  auVar124._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar76._0_4_ * 1.0000004);
  auVar124._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar76._4_4_ * 1.0000004);
  auVar124._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar76._8_4_ * 1.0000004);
  auVar124._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar76._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar124);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_2a8 = mm_lookupmask_ps._0_8_;
    uStack_2a0 = mm_lookupmask_ps._8_8_;
    local_2e0 = pre;
    local_210 = prim;
    do {
      lVar23 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      local_3d0 = (RTCIntersectArguments *)(ulong)*(uint *)(prim + 2);
      local_380 = (ulong)*(uint *)(prim + lVar23 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[(long)local_3d0].ptr;
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_380 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      local_3e8 = pGVar19->fnumTimeSegments;
      fVar157 = (pGVar19->time_range).lower;
      fVar157 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar157) /
                ((pGVar19->time_range).upper - fVar157)) * pGVar19->fnumTimeSegments;
      _local_418 = ZEXT416((uint)fVar157);
      fVar157 = floorf(fVar157);
      if (local_3e8 + -1.0 <= fVar157) {
        fVar157 = local_3e8 + -1.0;
      }
      fVar73 = 0.0;
      if (0.0 <= fVar157) {
        fVar73 = fVar157;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar55 = (long)(int)fVar73 * 0x38;
      lVar65 = *(long *)(_Var20 + 0x10 + lVar55);
      lVar64 = *(long *)(_Var20 + 0x38 + lVar55);
      lVar21 = *(long *)(_Var20 + 0x48 + lVar55);
      pfVar1 = (float *)(lVar64 + lVar21 * uVar62);
      lVar23 = uVar62 + 1;
      pfVar2 = (float *)(lVar64 + lVar21 * lVar23);
      p_Var22 = pGVar19[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var20 + lVar55) + lVar65 * uVar62);
      pfVar4 = (float *)(*(long *)(_Var20 + lVar55) + lVar65 * lVar23);
      pfVar5 = (float *)(*(long *)(p_Var22 + lVar55 + 0x38) +
                        uVar62 * *(long *)(p_Var22 + lVar55 + 0x48));
      fVar73 = (float)local_418._0_4_ - fVar73;
      fVar157 = 1.0 - fVar73;
      uVar61 = *(long *)(p_Var22 + lVar55 + 0x48) * lVar23;
      pfVar6 = (float *)(*(long *)(p_Var22 + lVar55 + 0x38) + uVar61);
      local_308 = *pfVar3 * fVar157 + *pfVar1 * fVar73;
      fStack_304 = pfVar3[1] * fVar157 + pfVar1[1] * fVar73;
      fStack_300 = pfVar3[2] * fVar157 + pfVar1[2] * fVar73;
      fStack_2fc = pfVar3[3] * fVar157 + pfVar1[3] * fVar73;
      pfVar1 = (float *)(*(long *)(p_Var22 + lVar55) + *(long *)(p_Var22 + lVar55 + 0x10) * uVar62);
      local_1d8 = *pfVar4 * fVar157 + *pfVar2 * fVar73;
      fStack_1d4 = pfVar4[1] * fVar157 + pfVar2[1] * fVar73;
      fStack_1d0 = pfVar4[2] * fVar157 + pfVar2[2] * fVar73;
      fStack_1cc = pfVar4[3] * fVar157 + pfVar2[3] * fVar73;
      pfVar2 = (float *)(*(long *)(p_Var22 + lVar55) + *(long *)(p_Var22 + lVar55 + 0x10) * lVar23);
      iVar18 = (int)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar214 = (*pfVar1 * fVar157 + *pfVar5 * fVar73) * 0.33333334 + local_308;
      fVar215 = (pfVar1[1] * fVar157 + pfVar5[1] * fVar73) * 0.33333334 + fStack_304;
      fVar219 = (pfVar1[2] * fVar157 + pfVar5[2] * fVar73) * 0.33333334 + fStack_300;
      fStack_1dc = (pfVar1[3] * fVar157 + pfVar5[3] * fVar73) * 0.33333334 + fStack_2fc;
      local_1f8 = local_1d8 - (fVar157 * *pfVar2 + fVar73 * *pfVar6) * 0.33333334;
      fStack_1f4 = fStack_1d4 - (fVar157 * pfVar2[1] + fVar73 * pfVar6[1]) * 0.33333334;
      fStack_1f0 = fStack_1d0 - (fVar157 * pfVar2[2] + fVar73 * pfVar6[2]) * 0.33333334;
      fStack_1ec = fStack_1cc - (fVar157 * pfVar2[3] + fVar73 * pfVar6[3]) * 0.33333334;
      fVar157 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar73 = (ray->super_RayK<1>).org.field_0.m128[1];
      fVar107 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar181 = local_308 - fVar157;
      fVar189 = fStack_304 - fVar73;
      fVar190 = fStack_300 - fVar107;
      fVar109 = (local_2e0->ray_space).vx.field_0.m128[0];
      fVar112 = (local_2e0->ray_space).vx.field_0.m128[1];
      fVar141 = (local_2e0->ray_space).vx.field_0.m128[2];
      fVar143 = (local_2e0->ray_space).vy.field_0.m128[0];
      fVar146 = (local_2e0->ray_space).vy.field_0.m128[1];
      fVar156 = (local_2e0->ray_space).vy.field_0.m128[2];
      fVar158 = (local_2e0->ray_space).vz.field_0.m128[0];
      fVar174 = (local_2e0->ray_space).vz.field_0.m128[1];
      fVar176 = (local_2e0->ray_space).vz.field_0.m128[2];
      local_1c8 = fVar181 * fVar109 + fVar189 * fVar143 + fVar190 * fVar158;
      local_158 = fVar181 * fVar112 + fVar189 * fVar146 + fVar190 * fVar174;
      local_418._4_4_ = fVar181 * fVar141 + fVar189 * fVar156 + fVar190 * fVar176;
      fVar181 = fVar214 - fVar157;
      fVar189 = fVar215 - fVar73;
      fVar190 = fVar219 - fVar107;
      local_3f8 = fVar181 * fVar109 + fVar189 * fVar143 + fVar190 * fVar158;
      local_408 = fVar181 * fVar112 + fVar189 * fVar146 + fVar190 * fVar174;
      local_288 = fVar181 * fVar141 + fVar189 * fVar156 + fVar190 * fVar176;
      fVar190 = local_1f8 - fVar157;
      fVar191 = fStack_1f4 - fVar73;
      fVar213 = fStack_1f0 - fVar107;
      local_3a8 = fVar190 * fVar109 + fVar191 * fVar143 + fVar213 * fVar158;
      fVar181 = fVar190 * fVar112 + fVar191 * fVar146 + fVar213 * fVar174;
      fVar189 = fVar190 * fVar141 + fVar191 * fVar156 + fVar213 * fVar176;
      fStack_3ac = fVar190 * (local_2e0->ray_space).vx.field_0.m128[3] +
                   fVar191 * (local_2e0->ray_space).vy.field_0.m128[3] +
                   fVar213 * (local_2e0->ray_space).vz.field_0.m128[3];
      fVar157 = local_1d8 - fVar157;
      fVar73 = fStack_1d4 - fVar73;
      fVar107 = fStack_1d0 - fVar107;
      local_398 = fVar157 * fVar109 + fVar73 * fVar143 + fVar107 * fVar158;
      uVar304 = fVar157 * fVar112 + fVar73 * fVar146 + fVar107 * fVar174;
      local_258 = fVar157 * fVar141 + fVar73 * fVar156 + fVar107 * fVar176;
      auVar235._0_8_ = CONCAT44(local_158,local_1c8) & 0x7fffffff7fffffff;
      auVar235._8_4_ = ABS((float)local_418._4_4_);
      auVar235._12_4_ = ABS(fStack_2fc);
      auVar182._0_8_ = CONCAT44(local_408,local_3f8) & 0x7fffffff7fffffff;
      auVar182._8_4_ = ABS(local_288);
      auVar182._12_4_ = ABS(fStack_1dc);
      auVar148 = maxps(auVar235,auVar182);
      auVar208._0_8_ = CONCAT44(fVar181,local_3a8) & 0x7fffffff7fffffff;
      auVar208._8_4_ = ABS(fVar189);
      auVar208._12_4_ = ABS(fStack_1ec);
      auVar125._0_8_ = CONCAT44(uVar304,local_398) & 0x7fffffff7fffffff;
      auVar125._8_4_ = ABS(local_258);
      auVar125._12_4_ = ABS(fStack_1cc);
      auVar76 = maxps(auVar208,auVar125);
      auVar76 = maxps(auVar148,auVar76);
      fVar157 = auVar76._4_4_;
      if (auVar76._4_4_ <= auVar76._0_4_) {
        fVar157 = auVar76._0_4_;
      }
      auVar236._8_8_ = auVar76._8_8_;
      auVar236._0_8_ = auVar76._8_8_;
      fVar73 = (float)iVar18;
      if (auVar76._8_4_ <= fVar157) {
        auVar236._0_4_ = fVar157;
      }
      _local_208 = ZEXT416((uint)fVar73);
      local_438._4_4_ = -(uint)(1.0 < fVar73);
      local_438._0_4_ = -(uint)(0.0 < fVar73);
      uStack_430._0_4_ = (float)-(uint)(2.0 < fVar73);
      uStack_430._4_4_ = (float)-(uint)(3.0 < fVar73);
      iVar57 = iVar18 * 0x40;
      lVar23 = (long)iVar18 * 0x44;
      local_358 = *(float *)(bezier_basis0 + lVar23 + 0x908);
      fStack_354 = *(float *)(bezier_basis0 + lVar23 + 0x90c);
      fStack_350 = *(float *)(bezier_basis0 + lVar23 + 0x910);
      fStack_34c = *(float *)(bezier_basis0 + lVar23 + 0x914);
      fStack_3a4 = local_3a8;
      fStack_3a0 = local_3a8;
      fStack_39c = local_3a8;
      local_268 = *(float *)(bezier_basis0 + lVar23 + 0xd8c);
      fStack_264 = *(float *)(bezier_basis0 + lVar23 + 0xd90);
      fStack_260 = *(float *)(bezier_basis0 + lVar23 + 0xd94);
      fStack_25c = *(float *)(bezier_basis0 + lVar23 + 0xd98);
      fStack_394 = local_398;
      fStack_390 = local_398;
      fStack_38c = local_398;
      local_3c8 = fVar181;
      fStack_3c4 = fVar181;
      fStack_3c0 = fVar181;
      fStack_3bc = fVar181;
      local_168 = fStack_1ec;
      fStack_164 = fStack_1ec;
      fStack_160 = fStack_1ec;
      fStack_15c = fStack_1ec;
      local_188 = *(float *)(bezier_basis0 + lVar23 + 0x484);
      fStack_184 = *(float *)(bezier_basis0 + lVar23 + 0x488);
      fStack_180 = *(float *)(bezier_basis0 + lVar23 + 0x48c);
      fStack_17c = *(float *)(bezier_basis0 + lVar23 + 0x490);
      local_1e8 = fVar214;
      fStack_1e4 = fVar215;
      fStack_1e0 = fVar219;
      pauVar7 = (undefined1 (*) [16])(bezier_basis0 + lVar23);
      fVar157 = *(float *)*pauVar7;
      fVar107 = *(float *)(bezier_basis0 + lVar23 + 4);
      fVar109 = *(float *)(bezier_basis0 + lVar23 + 8);
      auVar28 = *(undefined1 (*) [12])*pauVar7;
      fVar112 = *(float *)(bezier_basis0 + lVar23 + 0xc);
      local_178 = local_1c8 * fVar157 +
                  local_3f8 * local_188 + local_3a8 * local_358 + local_398 * local_268;
      fStack_174 = local_1c8 * fVar107 +
                   local_3f8 * fStack_184 + local_3a8 * fStack_354 + local_398 * fStack_264;
      fStack_170 = local_1c8 * fVar109 +
                   local_3f8 * fStack_180 + local_3a8 * fStack_350 + local_398 * fStack_260;
      fStack_16c = local_1c8 * fVar112 +
                   local_3f8 * fStack_17c + local_3a8 * fStack_34c + local_398 * fStack_25c;
      local_348 = local_158 * fVar157 +
                  local_408 * local_188 + fVar181 * local_358 + (float)uVar304 * local_268;
      fStack_344 = local_158 * fVar107 +
                   local_408 * fStack_184 + fVar181 * fStack_354 + (float)uVar304 * fStack_264;
      fStack_340 = local_158 * fVar109 +
                   local_408 * fStack_180 + fVar181 * fStack_350 + (float)uVar304 * fStack_260;
      fStack_33c = local_158 * fVar112 +
                   local_408 * fStack_17c + fVar181 * fStack_34c + (float)uVar304 * fStack_25c;
      _local_198 = *pauVar7;
      local_428._0_4_ =
           fStack_2fc * fVar157 +
           fStack_1dc * local_188 + fStack_1ec * local_358 + fStack_1cc * local_268;
      local_428._4_4_ =
           fStack_2fc * fVar107 +
           fStack_1dc * fStack_184 + fStack_1ec * fStack_354 + fStack_1cc * fStack_264;
      uStack_420._0_4_ =
           fStack_2fc * fVar109 +
           fStack_1dc * fStack_180 + fStack_1ec * fStack_350 + fStack_1cc * fStack_260;
      uStack_420._4_4_ =
           fStack_2fc * fVar112 +
           fStack_1dc * fStack_17c + fStack_1ec * fStack_34c + fStack_1cc * fStack_25c;
      fVar107 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar109 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fVar141 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fVar143 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      local_278 = *(float *)(bezier_basis1 + lVar23 + 0x908);
      fStack_274 = *(float *)(bezier_basis1 + lVar23 + 0x90c);
      fStack_270 = *(float *)(bezier_basis1 + lVar23 + 0x910);
      fStack_26c = *(float *)(bezier_basis1 + lVar23 + 0x914);
      local_44c.m128[1] = (float)uVar304;
      local_44c.m128[2] = (float)uVar304;
      local_44c.m128[3] = (float)uVar304;
      fStack_43c = (float)uVar304;
      local_58 = fStack_1cc;
      fStack_54 = fStack_1cc;
      fStack_50 = fStack_1cc;
      fStack_4c = fStack_1cc;
      fVar146 = *(float *)(bezier_basis1 + lVar23 + 0x484);
      fVar156 = *(float *)(bezier_basis1 + lVar23 + 0x488);
      fVar158 = *(float *)(bezier_basis1 + lVar23 + 0x48c);
      fVar174 = *(float *)(bezier_basis1 + lVar23 + 0x490);
      fStack_3f4 = local_3f8;
      fStack_3f0 = local_3f8;
      fStack_3ec = local_3f8;
      fStack_404 = local_408;
      fStack_400 = local_408;
      fStack_3fc = local_408;
      local_78 = fStack_1dc;
      fStack_74 = fStack_1dc;
      fStack_70 = fStack_1dc;
      fStack_6c = fStack_1dc;
      fVar176 = *(float *)(bezier_basis1 + lVar23);
      fVar190 = *(float *)(bezier_basis1 + lVar23 + 4);
      fVar191 = *(float *)(bezier_basis1 + lVar23 + 8);
      fVar213 = *(float *)(bezier_basis1 + lVar23 + 0xc);
      fStack_1c4 = local_1c8;
      fStack_1c0 = local_1c8;
      fStack_1bc = local_1c8;
      local_338._0_4_ =
           local_1c8 * fVar176 + local_3f8 * fVar146 + local_3a8 * local_278 + local_398 * fVar107;
      local_338._4_4_ =
           local_1c8 * fVar190 + local_3f8 * fVar156 + local_3a8 * fStack_274 + local_398 * fVar109;
      uStack_330._0_4_ =
           local_1c8 * fVar191 + local_3f8 * fVar158 + local_3a8 * fStack_270 + local_398 * fVar141;
      uStack_330._4_4_ =
           local_1c8 * fVar213 + local_3f8 * fVar174 + local_3a8 * fStack_26c + local_398 * fVar143;
      fStack_154 = local_158;
      fStack_150 = local_158;
      fStack_14c = local_158;
      fVar255 = local_158 * fVar176 +
                local_408 * fVar146 + fVar181 * local_278 + (float)uVar304 * fVar107;
      fVar263 = local_158 * fVar190 +
                local_408 * fVar156 + fVar181 * fStack_274 + (float)uVar304 * fVar109;
      fVar273 = local_158 * fVar191 +
                local_408 * fVar158 + fVar181 * fStack_270 + (float)uVar304 * fVar141;
      fVar277 = local_158 * fVar213 +
                local_408 * fVar174 + fVar181 * fStack_26c + (float)uVar304 * fVar143;
      local_88 = fStack_2fc;
      fStack_84 = fStack_2fc;
      fStack_80 = fStack_2fc;
      fStack_7c = fStack_2fc;
      auVar284._0_4_ =
           fStack_2fc * fVar176 +
           fStack_1dc * fVar146 + fStack_1ec * local_278 + fStack_1cc * fVar107;
      auVar284._4_4_ =
           fStack_2fc * fVar190 +
           fStack_1dc * fVar156 + fStack_1ec * fStack_274 + fStack_1cc * fVar109;
      auVar284._8_4_ =
           fStack_2fc * fVar191 +
           fStack_1dc * fVar158 + fStack_1ec * fStack_270 + fStack_1cc * fVar141;
      auVar284._12_4_ =
           fStack_2fc * fVar213 +
           fStack_1dc * fVar174 + fStack_1ec * fStack_26c + fStack_1cc * fVar143;
      fVar234 = (float)local_338._0_4_ - local_178;
      fVar238 = (float)local_338._4_4_ - fStack_174;
      fVar239 = (float)uStack_330 - fStack_170;
      fVar248 = uStack_330._4_4_ - fStack_16c;
      fVar258 = fVar255 - local_348;
      fVar271 = fVar263 - fStack_344;
      fVar275 = fVar273 - fStack_340;
      fVar287 = fVar277 - fStack_33c;
      fVar157 = local_348 * fVar234 - local_178 * fVar258;
      fVar220 = fStack_344 * fVar238 - fStack_174 * fVar271;
      fVar221 = fStack_340 * fVar239 - fStack_170 * fVar275;
      fVar229 = fStack_33c * fVar248 - fStack_16c * fVar287;
      auVar76 = maxps(_local_428,auVar284);
      bVar51 = fVar157 * fVar157 <=
               auVar76._0_4_ * auVar76._0_4_ * (fVar234 * fVar234 + fVar258 * fVar258) &&
               0.0 < fVar73;
      fVar289 = (float)-(uint)bVar51;
      bVar52 = fVar220 * fVar220 <=
               auVar76._4_4_ * auVar76._4_4_ * (fVar238 * fVar238 + fVar271 * fVar271) &&
               1.0 < fVar73;
      fVar290 = (float)-(uint)bVar52;
      bVar50 = fVar221 * fVar221 <=
               auVar76._8_4_ * auVar76._8_4_ * (fVar239 * fVar239 + fVar275 * fVar275) &&
               2.0 < fVar73;
      fVar292 = (float)-(uint)bVar50;
      bVar49 = fVar229 * fVar229 <=
               auVar76._12_4_ * auVar76._12_4_ * (fVar248 * fVar248 + fVar287 * fVar287) &&
               3.0 < fVar73;
      fVar297 = (float)-(uint)bVar49;
      local_3e8 = auVar236._0_4_;
      fStack_3e4 = auVar236._4_4_;
      fStack_3e0 = auVar236._8_4_;
      fStack_3dc = auVar236._12_4_;
      fVar221 = local_3e8 * 4.7683716e-07;
      local_3e8 = fVar221;
      auVar24._4_4_ = fVar290;
      auVar24._0_4_ = fVar289;
      auVar24._8_4_ = fVar292;
      auVar24._12_4_ = fVar297;
      iVar53 = movmskps(iVar18,auVar24);
      fVar157 = (ray->super_RayK<1>).org.field_0.m128[3];
      local_418._0_4_ = local_418._4_4_;
      fStack_410 = (float)local_418._4_4_;
      fStack_40c = (float)local_418._4_4_;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      uVar308 = uVar304;
      uVar310 = uVar304;
      fVar220 = (float)uVar304;
      fVar229 = fVar181;
      fVar231 = fVar181;
      fVar240 = fVar181;
      fVar246 = fVar189;
      fVar247 = fVar189;
      fVar291 = fVar189;
      local_3b8 = local_3a8;
      fStack_3b4 = fVar181;
      fStack_3b0 = fVar189;
      if (iVar53 != 0) {
        local_298 = fVar157;
        fStack_294 = 0.0;
        fStack_290 = 0.0;
        fStack_28c = 0.0;
        local_3b8 = fVar189;
        fStack_3b4 = fVar189;
        fStack_3ac = fVar189;
        fVar299 = local_278 * fVar189;
        fVar300 = fStack_274 * fVar189;
        fVar177 = fStack_270 * fVar189;
        fVar179 = fStack_26c * fVar189;
        local_278 = fVar258;
        fStack_274 = fVar271;
        fStack_270 = fVar275;
        fStack_26c = fVar287;
        fVar74 = fVar107 * local_258 + fVar299 + fVar146 * local_288 +
                 fVar176 * (float)local_418._4_4_;
        fVar108 = fVar109 * local_258 + fVar300 + fVar156 * local_288 +
                  fVar190 * (float)local_418._4_4_;
        fVar110 = fVar141 * local_258 + fVar177 + fVar158 * local_288 +
                  fVar191 * (float)local_418._4_4_;
        fVar111 = fVar143 * local_258 + fVar179 + fVar174 * local_288 +
                  fVar213 * (float)local_418._4_4_;
        local_198._0_4_ = auVar28._0_4_;
        local_198._4_4_ = auVar28._4_4_;
        fStack_190 = auVar28._8_4_;
        fVar159 = local_268 * local_258 + local_358 * fVar189 + local_188 * local_288 +
                  (float)local_198._0_4_ * (float)local_418._4_4_;
        fVar175 = fStack_264 * local_258 + fStack_354 * fVar189 + fStack_184 * local_288 +
                  (float)local_198._4_4_ * (float)local_418._4_4_;
        fVar178 = fStack_260 * local_258 + fStack_350 * fVar189 + fStack_180 * local_288 +
                  fStack_190 * (float)local_418._4_4_;
        fVar180 = fStack_25c * local_258 + fStack_34c * fVar189 + fStack_17c * local_288 +
                  fVar112 * (float)local_418._4_4_;
        _local_438 = auVar284;
        local_268 = fVar289;
        fStack_264 = fVar290;
        fStack_260 = fVar292;
        fStack_25c = fVar297;
        fVar107 = *(float *)(bezier_basis0 + lVar23 + 0x1210);
        fVar109 = *(float *)(bezier_basis0 + lVar23 + 0x1214);
        fVar112 = *(float *)(bezier_basis0 + lVar23 + 0x1218);
        fVar141 = *(float *)(bezier_basis0 + lVar23 + 0x121c);
        fVar143 = *(float *)(bezier_basis0 + lVar23 + 0x1694);
        fVar146 = *(float *)(bezier_basis0 + lVar23 + 0x1698);
        fVar156 = *(float *)(bezier_basis0 + lVar23 + 0x169c);
        fVar158 = *(float *)(bezier_basis0 + lVar23 + 0x16a0);
        fVar174 = *(float *)(bezier_basis0 + lVar23 + 0x1b18);
        fVar176 = *(float *)(bezier_basis0 + lVar23 + 0x1b1c);
        fVar190 = *(float *)(bezier_basis0 + lVar23 + 0x1b20);
        fVar191 = *(float *)(bezier_basis0 + lVar23 + 0x1b24);
        fVar213 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar289 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar290 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar292 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar249 = local_1c8 * fVar107 +
                  local_3f8 * fVar143 + local_3a8 * fVar174 + local_398 * fVar213;
        fVar256 = local_1c8 * fVar109 +
                  local_3f8 * fVar146 + local_3a8 * fVar176 + local_398 * fVar289;
        fVar259 = local_1c8 * fVar112 +
                  local_3f8 * fVar156 + local_3a8 * fVar190 + local_398 * fVar290;
        fVar261 = local_1c8 * fVar141 +
                  local_3f8 * fVar158 + local_3a8 * fVar191 + local_398 * fVar292;
        fVar306 = local_158 * fVar107 +
                  local_408 * fVar143 + fVar181 * fVar174 + (float)uVar304 * fVar213;
        fVar307 = local_158 * fVar109 +
                  local_408 * fVar146 + fVar181 * fVar176 + (float)uVar304 * fVar289;
        fVar309 = local_158 * fVar112 +
                  local_408 * fVar156 + fVar181 * fVar190 + (float)uVar304 * fVar290;
        fVar311 = local_158 * fVar141 +
                  local_408 * fVar158 + fVar181 * fVar191 + (float)uVar304 * fVar292;
        fVar297 = *(float *)(bezier_basis1 + lVar23 + 0x1210);
        fVar299 = *(float *)(bezier_basis1 + lVar23 + 0x1214);
        fVar300 = *(float *)(bezier_basis1 + lVar23 + 0x1218);
        fVar177 = *(float *)(bezier_basis1 + lVar23 + 0x121c);
        fVar179 = *(float *)(bezier_basis1 + lVar23 + 0x1b18);
        fVar298 = *(float *)(bezier_basis1 + lVar23 + 0x1b1c);
        fVar250 = *(float *)(bezier_basis1 + lVar23 + 0x1b20);
        fVar257 = *(float *)(bezier_basis1 + lVar23 + 0x1b24);
        fVar260 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar262 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar264 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar272 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar274 = *(float *)(bezier_basis1 + lVar23 + 0x1694);
        fVar276 = *(float *)(bezier_basis1 + lVar23 + 0x1698);
        fVar278 = *(float *)(bezier_basis1 + lVar23 + 0x169c);
        fVar288 = *(float *)(bezier_basis1 + lVar23 + 0x16a0);
        fVar222 = local_1c8 * fVar297 +
                  local_3f8 * fVar274 + local_3a8 * fVar179 + local_398 * fVar260;
        fVar230 = local_1c8 * fVar299 +
                  local_3f8 * fVar276 + local_3a8 * fVar298 + local_398 * fVar262;
        fVar232 = local_1c8 * fVar300 +
                  local_3f8 * fVar278 + local_3a8 * fVar250 + local_398 * fVar264;
        fVar233 = local_1c8 * fVar177 +
                  local_3f8 * fVar288 + local_3a8 * fVar257 + local_398 * fVar272;
        fVar113 = local_158 * fVar297 +
                  local_408 * fVar274 + fVar181 * fVar179 + (float)uVar304 * fVar260;
        fVar142 = local_158 * fVar299 +
                  local_408 * fVar276 + fVar181 * fVar298 + (float)uVar304 * fVar262;
        fVar144 = local_158 * fVar300 +
                  local_408 * fVar278 + fVar181 * fVar250 + (float)uVar304 * fVar264;
        fVar145 = local_158 * fVar177 +
                  local_408 * fVar288 + fVar181 * fVar257 + (float)uVar304 * fVar272;
        auVar285._0_8_ = CONCAT44(fVar256,fVar249) & 0x7fffffff7fffffff;
        auVar285._8_4_ = ABS(fVar259);
        auVar285._12_4_ = ABS(fVar261);
        auVar237._0_8_ = CONCAT44(fVar307,fVar306) & 0x7fffffff7fffffff;
        auVar237._8_4_ = ABS(fVar309);
        auVar237._12_4_ = ABS(fVar311);
        auVar76 = maxps(auVar285,auVar237);
        auVar293._0_8_ =
             CONCAT44(fVar109 * (float)local_418._4_4_ +
                      fVar146 * local_288 + fVar176 * fVar189 + fVar289 * local_258,
                      fVar107 * (float)local_418._4_4_ +
                      fVar143 * local_288 + fVar174 * fVar189 + fVar213 * local_258) &
             0x7fffffff7fffffff;
        auVar293._8_4_ =
             ABS(fVar112 * (float)local_418._4_4_ +
                 fVar156 * local_288 + fVar190 * fVar189 + fVar290 * local_258);
        auVar293._12_4_ =
             ABS(fVar141 * (float)local_418._4_4_ +
                 fVar158 * local_288 + fVar191 * fVar189 + fVar292 * local_258);
        auVar76 = maxps(auVar76,auVar293);
        uVar67 = -(uint)(fVar221 <= auVar76._0_4_);
        uVar68 = -(uint)(fVar221 <= auVar76._4_4_);
        uVar69 = -(uint)(fVar221 <= auVar76._8_4_);
        uVar70 = -(uint)(fVar221 <= auVar76._12_4_);
        auVar26._4_4_ = fVar238;
        auVar26._0_4_ = fVar234;
        auVar26._8_4_ = fVar239;
        auVar26._12_4_ = fVar248;
        fVar146 = (float)((uint)fVar249 & uVar67 | ~uVar67 & (uint)fVar234);
        fVar158 = (float)((uint)fVar256 & uVar68 | ~uVar68 & (uint)fVar238);
        fVar213 = (float)((uint)fVar259 & uVar69 | ~uVar69 & (uint)fVar239);
        fVar289 = (float)((uint)fVar261 & uVar70 | ~uVar70 & (uint)fVar248);
        fVar290 = (float)(~uVar67 & (uint)fVar258 | (uint)fVar306 & uVar67);
        fVar292 = (float)(~uVar68 & (uint)fVar271 | (uint)fVar307 & uVar68);
        fVar249 = (float)(~uVar69 & (uint)fVar275 | (uint)fVar309 & uVar69);
        fVar256 = (float)(~uVar70 & (uint)fVar287 | (uint)fVar311 & uVar70);
        auVar294._0_8_ = CONCAT44(fVar230,fVar222) & 0x7fffffff7fffffff;
        auVar294._8_4_ = ABS(fVar232);
        auVar294._12_4_ = ABS(fVar233);
        auVar245._0_8_ = CONCAT44(fVar142,fVar113) & 0x7fffffff7fffffff;
        auVar245._8_4_ = ABS(fVar144);
        auVar245._12_4_ = ABS(fVar145);
        auVar76 = maxps(auVar294,auVar245);
        auVar217._0_8_ =
             CONCAT44(fVar299 * (float)local_418._4_4_ +
                      fVar276 * local_288 + fVar298 * fVar189 + fVar262 * local_258,
                      fVar297 * (float)local_418._4_4_ +
                      fVar274 * local_288 + fVar179 * fVar189 + fVar260 * local_258) &
             0x7fffffff7fffffff;
        auVar217._8_4_ =
             ABS(fVar300 * (float)local_418._4_4_ +
                 fVar278 * local_288 + fVar250 * fVar189 + fVar264 * local_258);
        auVar217._12_4_ =
             ABS(fVar177 * (float)local_418._4_4_ +
                 fVar288 * local_288 + fVar257 * fVar189 + fVar272 * local_258);
        auVar76 = maxps(auVar76,auVar217);
        uVar67 = -(uint)(fVar221 <= auVar76._0_4_);
        uVar68 = -(uint)(fVar221 <= auVar76._4_4_);
        uVar69 = -(uint)(fVar221 <= auVar76._8_4_);
        uVar70 = -(uint)(fVar221 <= auVar76._12_4_);
        fVar143 = (float)((uint)fVar222 & uVar67 | ~uVar67 & (uint)fVar234);
        fVar156 = (float)((uint)fVar230 & uVar68 | ~uVar68 & (uint)fVar238);
        fVar174 = (float)((uint)fVar232 & uVar69 | ~uVar69 & (uint)fVar239);
        fVar176 = (float)((uint)fVar233 & uVar70 | ~uVar70 & (uint)fVar248);
        fVar234 = (float)(~uVar67 & (uint)fVar258 | (uint)fVar113 & uVar67);
        fVar238 = (float)(~uVar68 & (uint)fVar271 | (uint)fVar142 & uVar68);
        fVar239 = (float)(~uVar69 & (uint)fVar275 | (uint)fVar144 & uVar69);
        fVar248 = (float)(~uVar70 & (uint)fVar287 | (uint)fVar145 & uVar70);
        auVar126._0_4_ = fVar290 * fVar290 + fVar146 * fVar146;
        auVar126._4_4_ = fVar292 * fVar292 + fVar158 * fVar158;
        auVar126._8_4_ = fVar249 * fVar249 + fVar213 * fVar213;
        auVar126._12_4_ = fVar256 * fVar256 + fVar289 * fVar289;
        auVar76 = rsqrtps(auVar26,auVar126);
        fVar107 = auVar76._0_4_;
        fVar109 = auVar76._4_4_;
        fVar112 = auVar76._8_4_;
        fVar141 = auVar76._12_4_;
        auVar183._0_4_ = fVar107 * fVar107 * auVar126._0_4_ * 0.5 * fVar107;
        auVar183._4_4_ = fVar109 * fVar109 * auVar126._4_4_ * 0.5 * fVar109;
        auVar183._8_4_ = fVar112 * fVar112 * auVar126._8_4_ * 0.5 * fVar112;
        auVar183._12_4_ = fVar141 * fVar141 * auVar126._12_4_ * 0.5 * fVar141;
        fVar258 = fVar107 * 1.5 - auVar183._0_4_;
        fVar297 = fVar109 * 1.5 - auVar183._4_4_;
        fVar299 = fVar112 * 1.5 - auVar183._8_4_;
        fVar300 = fVar141 * 1.5 - auVar183._12_4_;
        auVar127._0_4_ = fVar234 * fVar234 + fVar143 * fVar143;
        auVar127._4_4_ = fVar238 * fVar238 + fVar156 * fVar156;
        auVar127._8_4_ = fVar239 * fVar239 + fVar174 * fVar174;
        auVar127._12_4_ = fVar248 * fVar248 + fVar176 * fVar176;
        auVar76 = rsqrtps(auVar183,auVar127);
        fVar107 = auVar76._0_4_;
        fVar109 = auVar76._4_4_;
        fVar112 = auVar76._8_4_;
        fVar141 = auVar76._12_4_;
        fVar107 = fVar107 * 1.5 - fVar107 * fVar107 * auVar127._0_4_ * 0.5 * fVar107;
        fVar190 = fVar109 * 1.5 - fVar109 * fVar109 * auVar127._4_4_ * 0.5 * fVar109;
        fVar112 = fVar112 * 1.5 - fVar112 * fVar112 * auVar127._8_4_ * 0.5 * fVar112;
        fVar191 = fVar141 * 1.5 - fVar141 * fVar141 * auVar127._12_4_ * 0.5 * fVar141;
        fVar271 = fVar290 * fVar258 * (float)local_428._0_4_;
        fVar275 = fVar292 * fVar297 * (float)local_428._4_4_;
        fVar287 = fVar249 * fVar299 * (float)uStack_420;
        fVar177 = fVar256 * fVar300 * uStack_420._4_4_;
        fVar109 = -fVar146 * fVar258 * (float)local_428._0_4_;
        fVar141 = -fVar158 * fVar297 * (float)local_428._4_4_;
        fVar146 = -fVar213 * fVar299 * (float)uStack_420;
        fVar158 = -fVar289 * fVar300 * uStack_420._4_4_;
        fVar222 = fVar258 * 0.0 * (float)local_428._0_4_;
        fVar230 = fVar297 * 0.0 * (float)local_428._4_4_;
        fVar232 = fVar299 * 0.0 * (float)uStack_420;
        fVar233 = fVar300 * 0.0 * uStack_420._4_4_;
        local_358 = fVar159 + fVar222;
        fStack_354 = fVar175 + fVar230;
        fStack_350 = fVar178 + fVar232;
        fStack_34c = fVar180 + fVar233;
        fVar289 = fVar234 * fVar107 * auVar284._0_4_;
        fVar298 = fVar238 * fVar190 * auVar284._4_4_;
        fVar144 = fVar239 * fVar112 * auVar284._8_4_;
        fVar145 = fVar248 * fVar191 * auVar284._12_4_;
        fVar250 = (float)local_338._0_4_ + fVar289;
        fVar257 = (float)local_338._4_4_ + fVar298;
        fVar260 = (float)uStack_330 + fVar144;
        fVar262 = uStack_330._4_4_ + fVar145;
        fVar248 = -fVar143 * fVar107 * auVar284._0_4_;
        fVar258 = -fVar156 * fVar190 * auVar284._4_4_;
        fVar297 = -fVar174 * fVar112 * auVar284._8_4_;
        fVar299 = -fVar176 * fVar191 * auVar284._12_4_;
        fVar264 = fVar255 + fVar248;
        fVar272 = fVar263 + fVar258;
        fVar274 = fVar273 + fVar297;
        fVar276 = fVar277 + fVar299;
        fVar213 = fVar107 * 0.0 * auVar284._0_4_;
        fVar234 = fVar190 * 0.0 * auVar284._4_4_;
        fVar238 = fVar112 * 0.0 * auVar284._8_4_;
        fVar239 = fVar191 * 0.0 * auVar284._12_4_;
        fVar290 = local_178 - fVar271;
        fVar292 = fStack_174 - fVar275;
        fVar300 = fStack_170 - fVar287;
        fVar179 = fStack_16c - fVar177;
        fVar278 = fVar74 + fVar213;
        fVar288 = fVar108 + fVar234;
        fVar113 = fVar110 + fVar238;
        fVar142 = fVar111 + fVar239;
        fVar107 = local_348 - fVar109;
        fVar112 = fStack_344 - fVar141;
        fVar143 = fStack_340 - fVar146;
        fVar156 = fStack_33c - fVar158;
        fVar159 = fVar159 - fVar222;
        fVar175 = fVar175 - fVar230;
        fVar178 = fVar178 - fVar232;
        fVar180 = fVar180 - fVar233;
        uVar67 = -(uint)(0.0 < (fVar107 * (fVar278 - fVar159) - fVar159 * (fVar264 - fVar107)) * 0.0
                               + (fVar159 * (fVar250 - fVar290) - (fVar278 - fVar159) * fVar290) *
                                 0.0 + ((fVar264 - fVar107) * fVar290 -
                                       (fVar250 - fVar290) * fVar107));
        uVar68 = -(uint)(0.0 < (fVar112 * (fVar288 - fVar175) - fVar175 * (fVar272 - fVar112)) * 0.0
                               + (fVar175 * (fVar257 - fVar292) - (fVar288 - fVar175) * fVar292) *
                                 0.0 + ((fVar272 - fVar112) * fVar292 -
                                       (fVar257 - fVar292) * fVar112));
        uVar69 = -(uint)(0.0 < (fVar143 * (fVar113 - fVar178) - fVar178 * (fVar274 - fVar143)) * 0.0
                               + (fVar178 * (fVar260 - fVar300) - (fVar113 - fVar178) * fVar300) *
                                 0.0 + ((fVar274 - fVar143) * fVar300 -
                                       (fVar260 - fVar300) * fVar143));
        uVar70 = -(uint)(0.0 < (fVar156 * (fVar142 - fVar180) - fVar180 * (fVar276 - fVar156)) * 0.0
                               + (fVar180 * (fVar262 - fVar179) - (fVar142 - fVar180) * fVar179) *
                                 0.0 + ((fVar276 - fVar156) * fVar179 -
                                       (fVar262 - fVar179) * fVar156));
        fVar271 = (float)((uint)((float)local_338._0_4_ - fVar289) & uVar67 |
                         ~uVar67 & (uint)(local_178 + fVar271));
        fVar275 = (float)((uint)((float)local_338._4_4_ - fVar298) & uVar68 |
                         ~uVar68 & (uint)(fStack_174 + fVar275));
        fVar287 = (float)((uint)((float)uStack_330 - fVar144) & uVar69 |
                         ~uVar69 & (uint)(fStack_170 + fVar287));
        fVar289 = (float)((uint)(uStack_330._4_4_ - fVar145) & uVar70 |
                         ~uVar70 & (uint)(fStack_16c + fVar177));
        fVar174 = (float)((uint)(fVar255 - fVar248) & uVar67 | ~uVar67 & (uint)(local_348 + fVar109)
                         );
        fVar176 = (float)((uint)(fVar263 - fVar258) & uVar68 |
                         ~uVar68 & (uint)(fStack_344 + fVar141));
        fVar190 = (float)((uint)(fVar273 - fVar297) & uVar69 |
                         ~uVar69 & (uint)(fStack_340 + fVar146));
        fVar191 = (float)((uint)(fVar277 - fVar299) & uVar70 |
                         ~uVar70 & (uint)(fStack_33c + fVar158));
        fVar248 = (float)((uint)(fVar74 - fVar213) & uVar67 | ~uVar67 & (uint)local_358);
        fVar255 = (float)((uint)(fVar108 - fVar234) & uVar68 | ~uVar68 & (uint)fStack_354);
        fVar258 = (float)((uint)(fVar110 - fVar238) & uVar69 | ~uVar69 & (uint)fStack_350);
        fVar263 = (float)((uint)(fVar111 - fVar239) & uVar70 | ~uVar70 & (uint)fStack_34c);
        fVar297 = (float)((uint)fVar290 & uVar67 | ~uVar67 & (uint)fVar250);
        fVar299 = (float)((uint)fVar292 & uVar68 | ~uVar68 & (uint)fVar257);
        fVar177 = (float)((uint)fVar300 & uVar69 | ~uVar69 & (uint)fVar260);
        fVar298 = (float)((uint)fVar179 & uVar70 | ~uVar70 & (uint)fVar262);
        fVar109 = (float)((uint)fVar107 & uVar67 | ~uVar67 & (uint)fVar264);
        fVar141 = (float)((uint)fVar112 & uVar68 | ~uVar68 & (uint)fVar272);
        fVar146 = (float)((uint)fVar143 & uVar69 | ~uVar69 & (uint)fVar274);
        fVar158 = (float)((uint)fVar156 & uVar70 | ~uVar70 & (uint)fVar276);
        fVar213 = (float)((uint)fVar159 & uVar67 | ~uVar67 & (uint)fVar278);
        fVar234 = (float)((uint)fVar175 & uVar68 | ~uVar68 & (uint)fVar288);
        fVar238 = (float)((uint)fVar178 & uVar69 | ~uVar69 & (uint)fVar113);
        fVar239 = (float)((uint)fVar180 & uVar70 | ~uVar70 & (uint)fVar142);
        fVar250 = (float)((uint)fVar250 & uVar67 | ~uVar67 & (uint)fVar290) - fVar271;
        fVar257 = (float)((uint)fVar257 & uVar68 | ~uVar68 & (uint)fVar292) - fVar275;
        fVar300 = (float)((uint)fVar260 & uVar69 | ~uVar69 & (uint)fVar300) - fVar287;
        fVar179 = (float)((uint)fVar262 & uVar70 | ~uVar70 & (uint)fVar179) - fVar289;
        fVar260 = (float)((uint)fVar264 & uVar67 | ~uVar67 & (uint)fVar107) - fVar174;
        fVar262 = (float)((uint)fVar272 & uVar68 | ~uVar68 & (uint)fVar112) - fVar176;
        fVar264 = (float)((uint)fVar274 & uVar69 | ~uVar69 & (uint)fVar143) - fVar190;
        fVar272 = (float)((uint)fVar276 & uVar70 | ~uVar70 & (uint)fVar156) - fVar191;
        fVar274 = (float)((uint)fVar278 & uVar67 | ~uVar67 & (uint)fVar159) - fVar248;
        fVar276 = (float)((uint)fVar288 & uVar68 | ~uVar68 & (uint)fVar175) - fVar255;
        fVar278 = (float)((uint)fVar113 & uVar69 | ~uVar69 & (uint)fVar178) - fVar258;
        fVar288 = (float)((uint)fVar142 & uVar70 | ~uVar70 & (uint)fVar180) - fVar263;
        fVar113 = fVar271 - fVar297;
        fVar142 = fVar275 - fVar299;
        fVar144 = fVar287 - fVar177;
        fVar145 = fVar289 - fVar298;
        fVar273 = fVar174 - fVar109;
        fVar277 = fVar176 - fVar141;
        fVar290 = fVar190 - fVar146;
        fVar292 = fVar191 - fVar158;
        fVar107 = fVar248 - fVar213;
        fVar112 = fVar255 - fVar234;
        fVar143 = fVar258 - fVar238;
        fVar156 = fVar263 - fVar239;
        fVar74 = (fVar174 * fVar274 - fVar248 * fVar260) * 0.0 +
                 (fVar248 * fVar250 - fVar271 * fVar274) * 0.0 +
                 (fVar271 * fVar260 - fVar174 * fVar250);
        fVar108 = (fVar176 * fVar276 - fVar255 * fVar262) * 0.0 +
                  (fVar255 * fVar257 - fVar275 * fVar276) * 0.0 +
                  (fVar275 * fVar262 - fVar176 * fVar257);
        auVar165._4_4_ = fVar108;
        auVar165._0_4_ = fVar74;
        fVar110 = (fVar190 * fVar278 - fVar258 * fVar264) * 0.0 +
                  (fVar258 * fVar300 - fVar287 * fVar278) * 0.0 +
                  (fVar287 * fVar264 - fVar190 * fVar300);
        fVar111 = (fVar191 * fVar288 - fVar263 * fVar272) * 0.0 +
                  (fVar263 * fVar179 - fVar289 * fVar288) * 0.0 +
                  (fVar289 * fVar272 - fVar191 * fVar179);
        auVar301._0_4_ =
             (fVar109 * fVar107 - fVar213 * fVar273) * 0.0 +
             (fVar213 * fVar113 - fVar297 * fVar107) * 0.0 + (fVar297 * fVar273 - fVar109 * fVar113)
        ;
        auVar301._4_4_ =
             (fVar141 * fVar112 - fVar234 * fVar277) * 0.0 +
             (fVar234 * fVar142 - fVar299 * fVar112) * 0.0 + (fVar299 * fVar277 - fVar141 * fVar142)
        ;
        auVar301._8_4_ =
             (fVar146 * fVar143 - fVar238 * fVar290) * 0.0 +
             (fVar238 * fVar144 - fVar177 * fVar143) * 0.0 + (fVar177 * fVar290 - fVar146 * fVar144)
        ;
        auVar301._12_4_ =
             (fVar158 * fVar156 - fVar239 * fVar292) * 0.0 +
             (fVar239 * fVar145 - fVar298 * fVar156) * 0.0 + (fVar298 * fVar292 - fVar158 * fVar145)
        ;
        auVar165._8_4_ = fVar110;
        auVar165._12_4_ = fVar111;
        auVar76 = maxps(auVar165,auVar301);
        bVar51 = auVar76._0_4_ <= 0.0 && bVar51;
        auVar166._0_4_ = -(uint)bVar51;
        bVar52 = auVar76._4_4_ <= 0.0 && bVar52;
        auVar166._4_4_ = -(uint)bVar52;
        bVar50 = auVar76._8_4_ <= 0.0 && bVar50;
        auVar166._8_4_ = -(uint)bVar50;
        bVar49 = auVar76._12_4_ <= 0.0 && bVar49;
        auVar166._12_4_ = -(uint)bVar49;
        iVar53 = movmskps(iVar53,auVar166);
        if (iVar53 == 0) {
          auVar167._8_8_ = uStack_2a0;
          auVar167._0_8_ = local_2a8;
          iVar53 = 0;
        }
        else {
          fVar109 = (ray->super_RayK<1>).tfar;
          auVar184._0_4_ = fVar107 * fVar260;
          auVar184._4_4_ = fVar112 * fVar262;
          auVar184._8_4_ = fVar143 * fVar264;
          auVar184._12_4_ = fVar156 * fVar272;
          fVar234 = fVar273 * fVar274 - auVar184._0_4_;
          fVar238 = fVar277 * fVar276 - auVar184._4_4_;
          fVar239 = fVar290 * fVar278 - auVar184._8_4_;
          fVar297 = fVar292 * fVar288 - auVar184._12_4_;
          fVar107 = fVar107 * fVar250 - fVar274 * fVar113;
          fVar141 = fVar112 * fVar257 - fVar276 * fVar142;
          fVar146 = fVar143 * fVar300 - fVar278 * fVar144;
          fVar158 = fVar156 * fVar179 - fVar288 * fVar145;
          fVar273 = fVar113 * fVar260 - fVar273 * fVar250;
          fVar277 = fVar142 * fVar262 - fVar277 * fVar257;
          fVar290 = fVar144 * fVar264 - fVar290 * fVar300;
          fVar292 = fVar145 * fVar272 - fVar292 * fVar179;
          auVar209._0_4_ = fVar234 * 0.0 + fVar107 * 0.0 + fVar273;
          auVar209._4_4_ = fVar238 * 0.0 + fVar141 * 0.0 + fVar277;
          auVar209._8_4_ = fVar239 * 0.0 + fVar146 * 0.0 + fVar290;
          auVar209._12_4_ = fVar297 * 0.0 + fVar158 * 0.0 + fVar292;
          auVar76 = rcpps(auVar184,auVar209);
          fVar112 = auVar76._0_4_;
          fVar143 = auVar76._4_4_;
          fVar156 = auVar76._8_4_;
          fVar213 = auVar76._12_4_;
          fVar112 = (1.0 - auVar209._0_4_ * fVar112) * fVar112 + fVar112;
          fVar143 = (1.0 - auVar209._4_4_ * fVar143) * fVar143 + fVar143;
          fVar156 = (1.0 - auVar209._8_4_ * fVar156) * fVar156 + fVar156;
          fVar213 = (1.0 - auVar209._12_4_ * fVar213) * fVar213 + fVar213;
          fVar107 = (fVar248 * fVar273 + fVar174 * fVar107 + fVar271 * fVar234) * fVar112;
          fVar141 = (fVar255 * fVar277 + fVar176 * fVar141 + fVar275 * fVar238) * fVar143;
          fVar146 = (fVar258 * fVar290 + fVar190 * fVar146 + fVar287 * fVar239) * fVar156;
          fVar158 = (fVar263 * fVar292 + fVar191 * fVar158 + fVar289 * fVar297) * fVar213;
          bVar51 = (fVar107 <= fVar109 && fVar157 <= fVar107) && bVar51;
          auVar98._0_4_ = -(uint)bVar51;
          bVar52 = (fVar141 <= fVar109 && fVar157 <= fVar141) && bVar52;
          auVar98._4_4_ = -(uint)bVar52;
          bVar50 = (fVar146 <= fVar109 && fVar157 <= fVar146) && bVar50;
          auVar98._8_4_ = -(uint)bVar50;
          bVar49 = (fVar158 <= fVar109 && fVar157 <= fVar158) && bVar49;
          auVar98._12_4_ = -(uint)bVar49;
          iVar53 = movmskps(iVar53,auVar98);
          if (iVar53 == 0) {
            auVar167._8_8_ = uStack_2a0;
            auVar167._0_8_ = local_2a8;
            iVar53 = 0;
          }
          else {
            auVar99._0_8_ =
                 CONCAT44(-(uint)(auVar209._4_4_ != 0.0 && bVar52),
                          -(uint)(auVar209._0_4_ != 0.0 && bVar51));
            auVar99._8_4_ = -(uint)(auVar209._8_4_ != 0.0 && bVar50);
            auVar99._12_4_ = -(uint)(auVar209._12_4_ != 0.0 && bVar49);
            iVar53 = movmskps(iVar53,auVar99);
            auVar167._8_8_ = uStack_2a0;
            auVar167._0_8_ = local_2a8;
            if (iVar53 != 0) {
              fVar74 = fVar74 * fVar112;
              fVar108 = fVar108 * fVar143;
              fVar110 = fVar110 * fVar156;
              fVar111 = fVar111 * fVar213;
              local_318 = (float)((uint)(1.0 - fVar74) & uVar67 | ~uVar67 & (uint)fVar74);
              fStack_314 = (float)((uint)(1.0 - fVar108) & uVar68 | ~uVar68 & (uint)fVar108);
              fStack_310 = (float)((uint)(1.0 - fVar110) & uVar69 | ~uVar69 & (uint)fVar110);
              fStack_30c = (float)((uint)(1.0 - fVar111) & uVar70 | ~uVar70 & (uint)fVar111);
              auVar167._8_4_ = auVar99._8_4_;
              auVar167._0_8_ = auVar99._0_8_;
              auVar167._12_4_ = auVar99._12_4_;
              local_1a8 = (float)(~uVar67 & (uint)(auVar301._0_4_ * fVar112) |
                                 (uint)(1.0 - auVar301._0_4_ * fVar112) & uVar67);
              fStack_1a4 = (float)(~uVar68 & (uint)(auVar301._4_4_ * fVar143) |
                                  (uint)(1.0 - auVar301._4_4_ * fVar143) & uVar68);
              fStack_1a0 = (float)(~uVar69 & (uint)(auVar301._8_4_ * fVar156) |
                                  (uint)(1.0 - auVar301._8_4_ * fVar156) & uVar69);
              fStack_19c = (float)(~uVar70 & (uint)(auVar301._12_4_ * fVar213) |
                                  (uint)(1.0 - auVar301._12_4_ * fVar213) & uVar70);
              local_328 = fVar107;
              fStack_324 = fVar141;
              fStack_320 = fVar146;
              fStack_31c = fVar158;
            }
          }
        }
        iVar53 = movmskps(iVar53,auVar167);
        if (iVar53 != 0) {
          fVar109 = (auVar284._0_4_ - (float)local_428._0_4_) * local_318 + (float)local_428._0_4_;
          fVar112 = (auVar284._4_4_ - (float)local_428._4_4_) * fStack_314 + (float)local_428._4_4_;
          fVar141 = (auVar284._8_4_ - (float)uStack_420) * fStack_310 + (float)uStack_420;
          fVar143 = (auVar284._12_4_ - uStack_420._4_4_) * fStack_30c + uStack_420._4_4_;
          fVar107 = local_2e0->depth_scale;
          auVar100._0_4_ = -(uint)(fVar107 * (fVar109 + fVar109) < local_328) & auVar167._0_4_;
          auVar100._4_4_ = -(uint)(fVar107 * (fVar112 + fVar112) < fStack_324) & auVar167._4_4_;
          auVar100._8_4_ = -(uint)(fVar107 * (fVar141 + fVar141) < fStack_320) & auVar167._8_4_;
          auVar100._12_4_ = -(uint)(fVar107 * (fVar143 + fVar143) < fStack_31c) & auVar167._12_4_;
          iVar53 = movmskps((int)local_2e0,auVar100);
          fVar107 = local_318;
          fVar109 = fStack_314;
          fVar112 = fStack_310;
          fVar141 = fStack_30c;
          fVar143 = local_328;
          fVar146 = fStack_324;
          fVar156 = fStack_320;
          fVar158 = fStack_31c;
          if (iVar53 != 0) {
            local_1a8 = local_1a8 + local_1a8 + -1.0;
            fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
            fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
            fStack_19c = fStack_19c + fStack_19c + -1.0;
            local_148 = local_318;
            fStack_144 = fStack_314;
            fStack_140 = fStack_310;
            fStack_13c = fStack_30c;
            local_138 = local_1a8;
            fStack_134 = fStack_1a4;
            fStack_130 = fStack_1a0;
            fStack_12c = fStack_19c;
            local_128 = local_328;
            fStack_124 = fStack_324;
            fStack_120 = fStack_320;
            fStack_11c = fStack_31c;
            local_118 = 0;
            local_114 = iVar18;
            local_108 = CONCAT44(fStack_304,local_308);
            uStack_100 = CONCAT44(fStack_2fc,fStack_300);
            local_f8 = CONCAT44(fVar215,fVar214);
            uStack_f0 = CONCAT44(fStack_1dc,fVar219);
            local_e8 = CONCAT44(fStack_1f4,local_1f8);
            uStack_e0 = CONCAT44(fStack_1ec,fStack_1f0);
            local_d8 = CONCAT44(fStack_1d4,local_1d8);
            uStack_d0 = CONCAT44(fStack_1cc,fStack_1d0);
            local_c8 = auVar100;
            uVar67 = (ray->super_RayK<1>).mask;
            if ((pGVar19->mask & uVar67) != 0) {
              local_2f8 = auVar100;
              fVar73 = 1.0 / fVar73;
              local_b8[0] = fVar73 * (local_318 + 0.0);
              local_b8[1] = fVar73 * (fStack_314 + 1.0);
              local_b8[2] = fVar73 * (fStack_310 + 2.0);
              local_b8[3] = fVar73 * (fStack_30c + 3.0);
              local_a8 = CONCAT44(fStack_1a4,local_1a8);
              uStack_a0 = CONCAT44(fStack_19c,fStack_1a0);
              local_98[0] = local_328;
              local_98[1] = fStack_324;
              local_98[2] = fStack_320;
              local_98[3] = fStack_31c;
              auVar128._0_4_ = auVar100._0_4_ & (uint)local_328;
              auVar128._4_4_ = auVar100._4_4_ & (uint)fStack_324;
              auVar128._8_4_ = auVar100._8_4_ & (uint)fStack_320;
              auVar128._12_4_ = auVar100._12_4_ & (uint)fStack_31c;
              auVar149._0_8_ = CONCAT44(~auVar100._4_4_,~auVar100._0_4_) & 0x7f8000007f800000;
              auVar149._8_4_ = ~auVar100._8_4_ & 0x7f800000;
              auVar149._12_4_ = ~auVar100._12_4_ & 0x7f800000;
              auVar149 = auVar149 | auVar128;
              auVar168._4_4_ = auVar149._0_4_;
              auVar168._0_4_ = auVar149._4_4_;
              auVar168._8_4_ = auVar149._12_4_;
              auVar168._12_4_ = auVar149._8_4_;
              auVar76 = minps(auVar168,auVar149);
              auVar129._0_8_ = auVar76._8_8_;
              auVar129._8_4_ = auVar76._0_4_;
              auVar129._12_4_ = auVar76._4_4_;
              auVar76 = minps(auVar129,auVar76);
              auVar130._0_8_ =
                   CONCAT44(-(uint)(auVar76._4_4_ == auVar149._4_4_) & auVar100._4_4_,
                            -(uint)(auVar76._0_4_ == auVar149._0_4_) & auVar100._0_4_);
              auVar130._8_4_ = -(uint)(auVar76._8_4_ == auVar149._8_4_) & auVar100._8_4_;
              auVar130._12_4_ = -(uint)(auVar76._12_4_ == auVar149._12_4_) & auVar100._12_4_;
              iVar53 = movmskps(uVar67,auVar130);
              if (iVar53 != 0) {
                auVar100._8_4_ = auVar130._8_4_;
                auVar100._0_8_ = auVar130._0_8_;
                auVar100._12_4_ = auVar130._12_4_;
              }
              uVar67 = movmskps(iVar53,auVar100);
              lVar65 = 0;
              if (uVar67 != 0) {
                for (; (uVar67 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar73 = local_b8[lVar65];
                fVar174 = *(float *)((long)&local_a8 + lVar65 * 4);
                fVar176 = 1.0 - fVar73;
                fVar191 = fVar73 * fVar176 + fVar73 * fVar176;
                fVar190 = fVar176 * fVar176 * -3.0;
                fVar213 = (fVar176 * fVar176 - fVar191) * 3.0;
                fVar176 = (fVar191 - fVar73 * fVar73) * 3.0;
                fVar191 = fVar73 * fVar73 * 3.0;
                (ray->super_RayK<1>).tfar = local_98[lVar65];
                *(ulong *)&(ray->Ng).field_0 =
                     CONCAT44(fVar190 * fStack_304 +
                              fVar213 * fVar215 + fVar176 * fStack_1f4 + fVar191 * fStack_1d4,
                              fVar190 * local_308 +
                              fVar213 * fVar214 + fVar176 * local_1f8 + fVar191 * local_1d8);
                (ray->Ng).field_0.field_0.z =
                     fVar190 * fStack_300 +
                     fVar213 * fVar219 + fVar176 * fStack_1f0 + fVar191 * fStack_1d0;
                ray->u = fVar73;
                ray->v = fVar174;
                ray->primID = (uint)local_380;
                ray->geomID = (uint)local_3d0;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pRVar60 = (RTCIntersectArguments *)context;
              }
              else {
                uStack_420 = CONCAT44(fStack_1ec,fStack_1f0);
                local_428 = (undefined1  [8])CONCAT44(fStack_1f4,local_1f8);
                uStack_430 = CONCAT44(fStack_1cc,fStack_1d0);
                local_438 = (undefined1  [8])CONCAT44(fStack_1d4,local_1d8);
                do {
                  local_23c = local_b8[lVar65];
                  local_238 = *(undefined4 *)((long)&local_a8 + lVar65 * 4);
                  fVar73 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = local_98[lVar65];
                  local_2d8.context = context->user;
                  fVar174 = 1.0 - local_23c;
                  fVar190 = local_23c * fVar174 + local_23c * fVar174;
                  fVar176 = fVar174 * fVar174 * -3.0;
                  fVar191 = (fVar174 * fVar174 - fVar190) * 3.0;
                  fVar174 = (fVar190 - local_23c * local_23c) * 3.0;
                  fVar190 = local_23c * local_23c * 3.0;
                  local_248 = CONCAT44(fVar176 * fStack_304 +
                                       fVar191 * fVar215 +
                                       fVar174 * (float)local_428._4_4_ +
                                       fVar190 * (float)local_438._4_4_,
                                       fVar176 * local_308 +
                                       fVar191 * fVar214 +
                                       fVar174 * (float)local_428._0_4_ +
                                       fVar190 * (float)local_438._0_4_);
                  local_240 = fVar176 * fStack_300 +
                              fVar191 * fVar219 +
                              fVar174 * (float)uStack_420 + fVar190 * (float)uStack_430;
                  local_234 = (int)local_380;
                  local_230 = (int)local_3d0;
                  local_22c = (local_2d8.context)->instID[0];
                  local_228 = (local_2d8.context)->instPrimID[0];
                  local_44c.m128[0] = -NAN;
                  local_2d8.valid = (int *)&local_44c;
                  pRVar60 = (RTCIntersectArguments *)pGVar19->userPtr;
                  local_2d8.geometryUserPtr = pRVar60;
                  local_2d8.ray = (RTCRayN *)ray;
                  local_2d8.hit = (RTCHitN *)&local_248;
                  local_2d8.N = 1;
                  if ((pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar19->intersectionFilterN)(&local_2d8), uVar61 = extraout_RDX_01,
                     uVar304 = local_44c.m128[1], uVar308 = local_44c.m128[2],
                     uVar310 = local_44c.m128[3], fVar220 = fStack_43c, fVar157 = local_298,
                     fVar107 = local_318, fVar109 = fStack_314, fVar112 = fStack_310,
                     fVar141 = fStack_30c, fVar181 = local_3c8, fVar229 = fStack_3c4,
                     fVar231 = fStack_3c0, fVar240 = fStack_3bc, fVar143 = local_328,
                     fVar146 = fStack_324, fVar156 = fStack_320, fVar158 = fStack_31c,
                     fVar189 = local_3b8, fVar246 = fStack_3b4, fVar247 = fStack_3b0,
                     fVar291 = fStack_3ac, *(float *)local_2d8.valid != 0.0)) {
                    pRVar60 = context->args;
                    if ((RTCIntersectArguments *)pRVar60->filter != (RTCIntersectArguments *)0x0) {
                      if ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0) ||
                         (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                        (*(code *)pRVar60->filter)(&local_2d8);
                        uVar61 = extraout_RDX_02;
                        uVar304 = local_44c.m128[1];
                        uVar308 = local_44c.m128[2];
                        uVar310 = local_44c.m128[3];
                        fVar220 = fStack_43c;
                        fVar157 = local_298;
                        fVar107 = local_318;
                        fVar109 = fStack_314;
                        fVar112 = fStack_310;
                        fVar141 = fStack_30c;
                        fVar181 = local_3c8;
                        fVar229 = fStack_3c4;
                        fVar231 = fStack_3c0;
                        fVar240 = fStack_3bc;
                        fVar143 = local_328;
                        fVar146 = fStack_324;
                        fVar156 = fStack_320;
                        fVar158 = fStack_31c;
                        fVar189 = local_3b8;
                        fVar246 = fStack_3b4;
                        fVar247 = fStack_3b0;
                        fVar291 = fStack_3ac;
                      }
                      if (*(float *)local_2d8.valid == 0.0) goto LAB_00c07f8a;
                    }
                    *(float *)((long)local_2d8.ray + 0x30) = *(float *)local_2d8.hit;
                    *(float *)((long)local_2d8.ray + 0x34) = *(float *)(local_2d8.hit + 4);
                    *(float *)((long)local_2d8.ray + 0x38) = *(float *)(local_2d8.hit + 8);
                    *(float *)((long)local_2d8.ray + 0x3c) = *(float *)(local_2d8.hit + 0xc);
                    *(float *)((long)local_2d8.ray + 0x40) = *(float *)(local_2d8.hit + 0x10);
                    *(float *)((long)local_2d8.ray + 0x44) = *(float *)(local_2d8.hit + 0x14);
                    *(float *)((long)local_2d8.ray + 0x48) = *(float *)(local_2d8.hit + 0x18);
                    uVar61 = (ulong)(uint)*(float *)(local_2d8.hit + 0x1c);
                    *(float *)((long)local_2d8.ray + 0x4c) = *(float *)(local_2d8.hit + 0x1c);
                    pRVar60 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_2d8.hit + 0x20)
                    ;
                    *(float *)((long)local_2d8.ray + 0x50) = *(float *)(local_2d8.hit + 0x20);
                    paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2d8.ray;
                  }
                  else {
LAB_00c07f8a:
                    (ray->super_RayK<1>).tfar = fVar73;
                    paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2d8.valid;
                  }
                  *(undefined4 *)(local_2f8 + lVar65 * 4) = 0;
                  fVar73 = (ray->super_RayK<1>).tfar;
                  auVar104._0_4_ = -(uint)(fVar143 <= fVar73) & local_2f8._0_4_;
                  auVar104._4_4_ = -(uint)(fVar146 <= fVar73) & local_2f8._4_4_;
                  auVar104._8_4_ = -(uint)(fVar156 <= fVar73) & local_2f8._8_4_;
                  auVar104._12_4_ = -(uint)(fVar158 <= fVar73) & local_2f8._12_4_;
                  local_2f8 = auVar104;
                  iVar53 = movmskps((int)paVar56,auVar104);
                  if (iVar53 != 0) {
                    auVar138._0_4_ = auVar104._0_4_ & (uint)fVar143;
                    auVar138._4_4_ = auVar104._4_4_ & (uint)fVar146;
                    auVar138._8_4_ = auVar104._8_4_ & (uint)fVar156;
                    auVar138._12_4_ = auVar104._12_4_ & (uint)fVar158;
                    auVar155._0_8_ = CONCAT44(~auVar104._4_4_,~auVar104._0_4_) & 0x7f8000007f800000;
                    auVar155._8_4_ = ~auVar104._8_4_ & 0x7f800000;
                    auVar155._12_4_ = ~auVar104._12_4_ & 0x7f800000;
                    auVar155 = auVar155 | auVar138;
                    auVar173._4_4_ = auVar155._0_4_;
                    auVar173._0_4_ = auVar155._4_4_;
                    auVar173._8_4_ = auVar155._12_4_;
                    auVar173._12_4_ = auVar155._8_4_;
                    auVar76 = minps(auVar173,auVar155);
                    auVar139._0_8_ = auVar76._8_8_;
                    auVar139._8_4_ = auVar76._0_4_;
                    auVar139._12_4_ = auVar76._4_4_;
                    auVar76 = minps(auVar139,auVar76);
                    auVar140._0_8_ =
                         CONCAT44(-(uint)(auVar76._4_4_ == auVar155._4_4_) & auVar104._4_4_,
                                  -(uint)(auVar76._0_4_ == auVar155._0_4_) & auVar104._0_4_);
                    auVar140._8_4_ = -(uint)(auVar76._8_4_ == auVar155._8_4_) & auVar104._8_4_;
                    auVar140._12_4_ = -(uint)(auVar76._12_4_ == auVar155._12_4_) & auVar104._12_4_;
                    iVar57 = movmskps((int)pRVar60,auVar140);
                    if (iVar57 != 0) {
                      auVar104._8_4_ = auVar140._8_4_;
                      auVar104._0_8_ = auVar140._0_8_;
                      auVar104._12_4_ = auVar140._12_4_;
                    }
                    uVar58 = movmskps(iVar57,auVar104);
                    pRVar60 = (RTCIntersectArguments *)
                              CONCAT44((int)((ulong)pRVar60 >> 0x20),uVar58);
                    lVar65 = 0;
                    if (pRVar60 != (RTCIntersectArguments *)0x0) {
                      for (; ((ulong)pRVar60 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                      }
                    }
                  }
                } while ((char)iVar53 != '\0');
              }
              iVar57 = (int)pRVar60;
              prim = local_210;
            }
          }
          local_318 = fVar107;
          fStack_314 = fVar109;
          fStack_310 = fVar112;
          fStack_30c = fVar141;
          fVar221 = local_3e8;
          local_328 = fVar143;
          fStack_324 = fVar146;
          fStack_320 = fVar156;
          fStack_31c = fVar158;
        }
      }
      if (4 < iVar18) {
        local_3b8 = fVar189;
        fStack_3b4 = fVar246;
        fStack_3b0 = fVar247;
        fStack_3ac = fVar291;
        local_68 = iVar18;
        iStack_64 = iVar18;
        iStack_60 = iVar18;
        iStack_5c = iVar18;
        local_208._4_4_ = 1.0 / (float)local_208._0_4_;
        local_208._0_4_ = local_208._4_4_;
        fStack_200 = (float)local_208._4_4_;
        fStack_1fc = (float)local_208._4_4_;
        lVar65 = 4;
        fStack_3e4 = fVar221;
        local_3e8 = fVar221;
        fStack_3e0 = fVar221;
        fStack_3dc = fVar221;
        local_298 = fVar157;
        fStack_294 = fVar157;
        fStack_290 = fVar157;
        fStack_28c = fVar157;
        fVar157 = local_3a8;
        fVar73 = fStack_3a4;
        fVar107 = fStack_3a0;
        fVar109 = fStack_39c;
        fVar112 = local_398;
        fVar141 = fStack_394;
        fVar143 = fStack_390;
        fVar146 = fStack_38c;
        do {
          fVar255 = fStack_1e0;
          fVar248 = fStack_1e4;
          fVar239 = local_1e8;
          uVar68 = (uint)lVar65;
          pRVar60 = (RTCIntersectArguments *)(bezier_basis0 + lVar23);
          pfVar1 = (float *)((long)&pRVar60->flags + lVar65 * 4);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2227768 + lVar65 * 4);
          local_358 = *pfVar1;
          fStack_354 = pfVar1[1];
          fStack_350 = pfVar1[2];
          fStack_34c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2227bec + lVar65 * 4);
          local_188 = *pfVar1;
          fStack_184 = pfVar1[1];
          fStack_180 = pfVar1[2];
          fStack_17c = pfVar1[3];
          pauVar7 = (undefined1 (*) [16])(lVar23 + 0x2228070 + lVar65 * 4);
          fVar156 = *(float *)*pauVar7;
          fVar158 = *(float *)(*pauVar7 + 4);
          fVar174 = *(float *)(*pauVar7 + 8);
          auVar28 = *(undefined1 (*) [12])*pauVar7;
          fVar176 = *(float *)(*pauVar7 + 0xc);
          _local_428 = *pauVar7;
          local_178 = local_1c8 * local_348 +
                      local_3f8 * local_358 + fVar157 * local_188 + fVar112 * fVar156;
          fStack_174 = fStack_1c4 * fStack_344 +
                       fStack_3f4 * fStack_354 + fVar73 * fStack_184 + fVar141 * fVar158;
          fStack_170 = fStack_1c0 * fStack_340 +
                       fStack_3f0 * fStack_350 + fVar107 * fStack_180 + fVar143 * fVar174;
          fStack_16c = fStack_1bc * fStack_33c +
                       fStack_3ec * fStack_34c + fVar109 * fStack_17c + fVar146 * fVar176;
          local_268 = local_158 * local_348 +
                      local_408 * local_358 + fVar181 * local_188 + (float)uVar304 * fVar156;
          fStack_264 = fStack_154 * fStack_344 +
                       fStack_404 * fStack_354 + fVar229 * fStack_184 + (float)uVar308 * fVar158;
          fStack_260 = fStack_150 * fStack_340 +
                       fStack_400 * fStack_350 + fVar231 * fStack_180 + (float)uVar310 * fVar174;
          fStack_25c = fStack_14c * fStack_33c +
                       fStack_3fc * fStack_34c + fVar240 * fStack_17c + fVar220 * fVar176;
          local_438._0_4_ =
               local_88 * local_348 +
               local_78 * local_358 + local_168 * local_188 + local_58 * fVar156;
          local_438._4_4_ =
               fStack_84 * fStack_344 +
               fStack_74 * fStack_354 + fStack_164 * fStack_184 + fStack_54 * fVar158;
          uStack_430._0_4_ =
               fStack_80 * fStack_340 +
               fStack_70 * fStack_350 + fStack_160 * fStack_180 + fStack_50 * fVar174;
          uStack_430._4_4_ =
               fStack_7c * fStack_33c +
               fStack_6c * fStack_34c + fStack_15c * fStack_17c + fStack_4c * fVar176;
          pfVar1 = (float *)(bezier_basis1 + lVar23 + lVar65 * 4);
          fVar156 = *pfVar1;
          fVar158 = pfVar1[1];
          fVar174 = pfVar1[2];
          fVar189 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x2229b88 + lVar65 * 4);
          fVar190 = *pfVar1;
          fVar191 = pfVar1[1];
          fVar213 = pfVar1[2];
          fVar214 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x222a00c + lVar65 * 4);
          fVar215 = *pfVar1;
          fVar219 = pfVar1[1];
          fVar221 = pfVar1[2];
          fVar246 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x222a490 + lVar65 * 4);
          fVar247 = *pfVar1;
          fVar291 = pfVar1[1];
          fVar234 = pfVar1[2];
          fVar238 = pfVar1[3];
          fVar300 = local_1c8 * fVar156 +
                    local_3f8 * fVar190 + local_3a8 * fVar215 + fVar112 * fVar247;
          fVar177 = fStack_1c4 * fVar158 +
                    fStack_3f4 * fVar191 + fStack_3a4 * fVar219 + fVar141 * fVar291;
          fVar179 = fStack_1c0 * fVar174 +
                    fStack_3f0 * fVar213 + fStack_3a0 * fVar221 + fVar143 * fVar234;
          fVar298 = fStack_1bc * fVar189 +
                    fStack_3ec * fVar214 + fStack_39c * fVar246 + fVar146 * fVar238;
          fVar250 = local_158 * fVar156 +
                    local_408 * fVar190 + fVar181 * fVar215 + (float)uVar304 * fVar247;
          fVar257 = fStack_154 * fVar158 +
                    fStack_404 * fVar191 + fVar229 * fVar219 + (float)uVar308 * fVar291;
          fVar260 = fStack_150 * fVar174 +
                    fStack_400 * fVar213 + fVar231 * fVar221 + (float)uVar310 * fVar234;
          fVar262 = fStack_14c * fVar189 +
                    fStack_3fc * fVar214 + fVar240 * fVar246 + fVar220 * fVar238;
          auVar302._0_4_ =
               local_88 * fVar156 + local_78 * fVar190 + local_168 * fVar215 + local_58 * fVar247;
          auVar302._4_4_ =
               fStack_84 * fVar158 +
               fStack_74 * fVar191 + fStack_164 * fVar219 + fStack_54 * fVar291;
          auVar302._8_4_ =
               fStack_80 * fVar174 +
               fStack_70 * fVar213 + fStack_160 * fVar221 + fStack_50 * fVar234;
          auVar302._12_4_ =
               fStack_7c * fVar189 +
               fStack_6c * fVar214 + fStack_15c * fVar246 + fStack_4c * fVar238;
          fVar290 = fVar300 - local_178;
          fVar292 = fVar177 - fStack_174;
          fVar297 = fVar179 - fStack_170;
          fVar299 = fVar298 - fStack_16c;
          fVar275 = fVar250 - local_268;
          fVar277 = fVar257 - fStack_264;
          fVar287 = fVar260 - fStack_260;
          fVar289 = fVar262 - fStack_25c;
          fVar157 = local_268 * fVar290 - local_178 * fVar275;
          fVar73 = fStack_264 * fVar292 - fStack_174 * fVar277;
          fVar107 = fStack_260 * fVar297 - fStack_170 * fVar287;
          fVar109 = fStack_25c * fVar299 - fStack_16c * fVar289;
          auVar76 = maxps(_local_438,auVar302);
          bVar49 = fVar157 * fVar157 <=
                   auVar76._0_4_ * auVar76._0_4_ * (fVar290 * fVar290 + fVar275 * fVar275) &&
                   (int)uVar68 < local_68;
          auVar228._0_4_ = -(uint)bVar49;
          bVar50 = fVar73 * fVar73 <=
                   auVar76._4_4_ * auVar76._4_4_ * (fVar292 * fVar292 + fVar277 * fVar277) &&
                   (int)(uVar68 | 1) < iStack_64;
          auVar228._4_4_ = -(uint)bVar50;
          bVar51 = fVar107 * fVar107 <=
                   auVar76._8_4_ * auVar76._8_4_ * (fVar297 * fVar297 + fVar287 * fVar287) &&
                   (int)(uVar68 | 2) < iStack_60;
          auVar228._8_4_ = -(uint)bVar51;
          bVar52 = fVar109 * fVar109 <=
                   auVar76._12_4_ * auVar76._12_4_ * (fVar299 * fVar299 + fVar289 * fVar289) &&
                   (int)(uVar68 | 3) < iStack_5c;
          auVar228._12_4_ = -(uint)bVar52;
          uVar67 = movmskps((int)uVar61,auVar228);
          uVar61 = (ulong)uVar67;
          uVar304 = local_44c.m128[1];
          uVar308 = local_44c.m128[2];
          uVar310 = local_44c.m128[3];
          fVar220 = fStack_43c;
          fVar157 = local_3a8;
          fVar73 = fStack_3a4;
          fVar107 = fStack_3a0;
          fVar109 = fStack_39c;
          fVar181 = local_368;
          fVar229 = fStack_364;
          fVar231 = fStack_360;
          fVar240 = fStack_35c;
          fVar258 = local_378;
          fVar263 = fStack_374;
          fVar271 = fStack_370;
          fVar273 = fStack_36c;
          fVar112 = local_398;
          fVar141 = fStack_394;
          fVar143 = fStack_390;
          fVar146 = fStack_38c;
          if (uVar67 != 0) {
            _local_338 = auVar302;
            _local_198 = auVar228;
            local_278 = fVar290;
            fStack_274 = fVar292;
            fStack_270 = fVar297;
            fStack_26c = fVar299;
            fVar108 = fVar247 * local_258 + fVar215 * local_3b8 + fVar190 * local_288 +
                      fVar156 * (float)local_418._0_4_;
            fVar110 = fVar291 * fStack_254 + fVar219 * fStack_3b4 + fVar191 * fStack_284 +
                      fVar158 * (float)local_418._4_4_;
            fVar111 = fVar234 * fStack_250 + fVar221 * fStack_3b0 + fVar213 * fStack_280 +
                      fVar174 * fStack_410;
            fVar113 = fVar238 * fStack_24c + fVar246 * fStack_3ac + fVar214 * fStack_27c +
                      fVar189 * fStack_40c;
            local_428._0_4_ = auVar28._0_4_;
            local_428._4_4_ = auVar28._4_4_;
            uStack_420._0_4_ = auVar28._8_4_;
            fVar175 = (float)local_428._0_4_ * local_258 + local_188 * local_3b8 +
                      local_358 * local_288 + local_348 * (float)local_418._0_4_;
            fVar178 = (float)local_428._4_4_ * fStack_254 + fStack_184 * fStack_3b4 +
                      fStack_354 * fStack_284 + fStack_344 * (float)local_418._4_4_;
            fVar180 = (float)uStack_420 * fStack_250 + fStack_180 * fStack_3b0 +
                      fStack_350 * fStack_280 + fStack_340 * fStack_410;
            fVar222 = fVar176 * fStack_24c + fStack_17c * fStack_3ac + fStack_34c * fStack_27c +
                      fStack_33c * fStack_40c;
            pfVar1 = (float *)(lVar23 + 0x22284f4 + lVar65 * 4);
            fVar156 = *pfVar1;
            fVar158 = pfVar1[1];
            fVar174 = pfVar1[2];
            fVar176 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x2228978 + lVar65 * 4);
            fVar181 = *pfVar1;
            fVar189 = pfVar1[1];
            fVar190 = pfVar1[2];
            fVar191 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x2228dfc + lVar65 * 4);
            fVar213 = *pfVar1;
            fVar214 = pfVar1[1];
            fVar215 = pfVar1[2];
            fVar219 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x2229280 + lVar65 * 4);
            fVar221 = *pfVar1;
            fVar229 = pfVar1[1];
            fVar231 = pfVar1[2];
            fVar240 = pfVar1[3];
            fVar256 = local_1c8 * fVar156 +
                      local_3f8 * fVar181 + local_3a8 * fVar213 + local_398 * fVar221;
            fVar259 = fStack_1c4 * fVar158 +
                      fStack_3f4 * fVar189 + fStack_3a4 * fVar214 + fStack_394 * fVar229;
            fVar261 = fStack_1c0 * fVar174 +
                      fStack_3f0 * fVar190 + fStack_3a0 * fVar215 + fStack_390 * fVar231;
            fVar306 = fStack_1bc * fVar176 +
                      fStack_3ec * fVar191 + fStack_39c * fVar219 + fStack_38c * fVar240;
            fVar142 = local_158 * fVar156 +
                      local_408 * fVar181 + local_3c8 * fVar213 + local_44c.m128[1] * fVar221;
            fVar144 = fStack_154 * fVar158 +
                      fStack_404 * fVar189 + fStack_3c4 * fVar214 + local_44c.m128[2] * fVar229;
            fVar145 = fStack_150 * fVar174 +
                      fStack_400 * fVar190 + fStack_3c0 * fVar215 + local_44c.m128[3] * fVar231;
            fVar159 = fStack_14c * fVar176 +
                      fStack_3fc * fVar191 + fStack_3bc * fVar219 + fStack_43c * fVar240;
            pfVar1 = (float *)(lVar23 + 0x222a914 + lVar65 * 4);
            fVar246 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar291 = pfVar1[2];
            fVar234 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x222b21c + lVar65 * 4);
            fVar238 = *pfVar1;
            fVar258 = pfVar1[1];
            fVar263 = pfVar1[2];
            fVar271 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x222b6a0 + lVar65 * 4);
            fVar273 = *pfVar1;
            fVar264 = pfVar1[1];
            fVar272 = pfVar1[2];
            fVar274 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x222ad98 + lVar65 * 4);
            fVar276 = *pfVar1;
            fVar278 = pfVar1[1];
            fVar288 = pfVar1[2];
            fVar74 = pfVar1[3];
            fVar307 = local_1c8 * fVar246 +
                      local_3f8 * fVar276 + local_3a8 * fVar238 + local_398 * fVar273;
            fVar309 = fStack_1c4 * fVar247 +
                      fStack_3f4 * fVar278 + fStack_3a4 * fVar258 + fStack_394 * fVar264;
            fVar311 = fStack_1c0 * fVar291 +
                      fStack_3f0 * fVar288 + fStack_3a0 * fVar263 + fStack_390 * fVar272;
            fVar305 = fStack_1bc * fVar234 +
                      fStack_3ec * fVar74 + fStack_39c * fVar271 + fStack_38c * fVar274;
            fVar230 = local_158 * fVar246 +
                      local_408 * fVar276 + local_3c8 * fVar238 + local_44c.m128[1] * fVar273;
            fVar232 = fStack_154 * fVar247 +
                      fStack_404 * fVar278 + fStack_3c4 * fVar258 + local_44c.m128[2] * fVar264;
            fVar233 = fStack_150 * fVar291 +
                      fStack_400 * fVar288 + fStack_3c0 * fVar263 + local_44c.m128[3] * fVar272;
            fVar249 = fStack_14c * fVar234 +
                      fStack_3fc * fVar74 + fStack_3bc * fVar271 + fStack_43c * fVar274;
            auVar286._0_8_ = CONCAT44(fVar259,fVar256) & 0x7fffffff7fffffff;
            auVar286._8_4_ = ABS(fVar261);
            auVar286._12_4_ = ABS(fVar306);
            auVar210._0_8_ = CONCAT44(fVar144,fVar142) & 0x7fffffff7fffffff;
            auVar210._8_4_ = ABS(fVar145);
            auVar210._12_4_ = ABS(fVar159);
            auVar76 = maxps(auVar286,auVar210);
            auVar295._0_8_ =
                 CONCAT44(fVar158 * (float)local_418._4_4_ +
                          fVar189 * fStack_284 + fVar214 * fStack_3b4 + fVar229 * fStack_254,
                          fVar156 * (float)local_418._0_4_ +
                          fVar181 * local_288 + fVar213 * local_3b8 + fVar221 * local_258) &
                 0x7fffffff7fffffff;
            auVar295._8_4_ =
                 ABS(fVar174 * fStack_410 +
                     fVar190 * fStack_280 + fVar215 * fStack_3b0 + fVar231 * fStack_250);
            auVar295._12_4_ =
                 ABS(fVar176 * fStack_40c +
                     fVar191 * fStack_27c + fVar219 * fStack_3ac + fVar240 * fStack_24c);
            auVar76 = maxps(auVar76,auVar295);
            uVar67 = -(uint)(local_3e8 <= auVar76._0_4_);
            uVar69 = -(uint)(fStack_3e4 <= auVar76._4_4_);
            uVar70 = -(uint)(fStack_3e0 <= auVar76._8_4_);
            uVar71 = -(uint)(fStack_3dc <= auVar76._12_4_);
            auVar211._0_4_ = ~uVar67 & (uint)fVar290;
            auVar211._4_4_ = ~uVar69 & (uint)fVar292;
            auVar211._8_4_ = ~uVar70 & (uint)fVar297;
            auVar211._12_4_ = ~uVar71 & (uint)fVar299;
            auVar270._0_4_ = (uint)fVar256 & uVar67;
            auVar270._4_4_ = (uint)fVar259 & uVar69;
            auVar270._8_4_ = (uint)fVar261 & uVar70;
            auVar270._12_4_ = (uint)fVar306 & uVar71;
            auVar270 = auVar270 | auVar211;
            fVar214 = (float)(~uVar67 & (uint)fVar275 | (uint)fVar142 & uVar67);
            fVar219 = (float)(~uVar69 & (uint)fVar277 | (uint)fVar144 & uVar69);
            fVar142 = (float)(~uVar70 & (uint)fVar287 | (uint)fVar145 & uVar70);
            fVar144 = (float)(~uVar71 & (uint)fVar289 | (uint)fVar159 & uVar71);
            auVar296._0_8_ = CONCAT44(fVar309,fVar307) & 0x7fffffff7fffffff;
            auVar296._8_4_ = ABS(fVar311);
            auVar296._12_4_ = ABS(fVar305);
            auVar150._0_8_ = CONCAT44(fVar232,fVar230) & 0x7fffffff7fffffff;
            auVar150._8_4_ = ABS(fVar233);
            auVar150._12_4_ = ABS(fVar249);
            auVar76 = maxps(auVar296,auVar150);
            auVar101._0_8_ =
                 CONCAT44(fVar247 * (float)local_418._4_4_ +
                          fVar278 * fStack_284 + fVar258 * fStack_3b4 + fVar264 * fStack_254,
                          fVar246 * (float)local_418._0_4_ +
                          fVar276 * local_288 + fVar238 * local_3b8 + fVar273 * local_258) &
                 0x7fffffff7fffffff;
            auVar101._8_4_ =
                 ABS(fVar291 * fStack_410 +
                     fVar288 * fStack_280 + fVar263 * fStack_3b0 + fVar272 * fStack_250);
            auVar101._12_4_ =
                 ABS(fVar234 * fStack_40c +
                     fVar74 * fStack_27c + fVar271 * fStack_3ac + fVar274 * fStack_24c);
            auVar76 = maxps(auVar76,auVar101);
            uVar67 = -(uint)(local_3e8 <= auVar76._0_4_);
            uVar69 = -(uint)(fStack_3e4 <= auVar76._4_4_);
            uVar70 = -(uint)(fStack_3e0 <= auVar76._8_4_);
            uVar71 = -(uint)(fStack_3dc <= auVar76._12_4_);
            fVar264 = (float)((uint)fVar307 & uVar67 | ~uVar67 & (uint)fVar290);
            fVar272 = (float)((uint)fVar309 & uVar69 | ~uVar69 & (uint)fVar292);
            fVar274 = (float)((uint)fVar311 & uVar70 | ~uVar70 & (uint)fVar297);
            fVar299 = (float)((uint)fVar305 & uVar71 | ~uVar71 & (uint)fVar299);
            fVar246 = (float)(~uVar67 & (uint)fVar275 | (uint)fVar230 & uVar67);
            fVar291 = (float)(~uVar69 & (uint)fVar277 | (uint)fVar232 & uVar69);
            fVar238 = (float)(~uVar70 & (uint)fVar287 | (uint)fVar233 & uVar70);
            fVar263 = (float)(~uVar71 & (uint)fVar289 | (uint)fVar249 & uVar71);
            fVar191 = auVar270._0_4_;
            fVar156 = auVar270._4_4_;
            fVar158 = auVar270._8_4_;
            fVar174 = auVar270._12_4_;
            auVar185._0_4_ = fVar214 * fVar214 + fVar191 * fVar191;
            auVar185._4_4_ = fVar219 * fVar219 + fVar156 * fVar156;
            auVar185._8_4_ = fVar142 * fVar142 + fVar158 * fVar158;
            auVar185._12_4_ = fVar144 * fVar144 + fVar174 * fVar174;
            auVar76 = rsqrtps(auVar211,auVar185);
            fVar176 = auVar76._0_4_;
            fVar181 = auVar76._4_4_;
            fVar189 = auVar76._8_4_;
            fVar190 = auVar76._12_4_;
            auVar212._0_4_ = fVar176 * fVar176 * auVar185._0_4_ * 0.5 * fVar176;
            auVar212._4_4_ = fVar181 * fVar181 * auVar185._4_4_ * 0.5 * fVar181;
            auVar212._8_4_ = fVar189 * fVar189 * auVar185._8_4_ * 0.5 * fVar189;
            auVar212._12_4_ = fVar190 * fVar190 * auVar185._12_4_ * 0.5 * fVar190;
            fVar221 = fVar176 * 1.5 - auVar212._0_4_;
            fVar229 = fVar181 * 1.5 - auVar212._4_4_;
            fVar231 = fVar189 * 1.5 - auVar212._8_4_;
            fVar240 = fVar190 * 1.5 - auVar212._12_4_;
            auVar186._0_4_ = fVar246 * fVar246 + fVar264 * fVar264;
            auVar186._4_4_ = fVar291 * fVar291 + fVar272 * fVar272;
            auVar186._8_4_ = fVar238 * fVar238 + fVar274 * fVar274;
            auVar186._12_4_ = fVar263 * fVar263 + fVar299 * fVar299;
            auVar76 = rsqrtps(auVar212,auVar186);
            fVar176 = auVar76._0_4_;
            fVar181 = auVar76._4_4_;
            fVar189 = auVar76._8_4_;
            fVar190 = auVar76._12_4_;
            fVar213 = fVar176 * 1.5 - fVar176 * fVar176 * auVar186._0_4_ * 0.5 * fVar176;
            fVar181 = fVar181 * 1.5 - fVar181 * fVar181 * auVar186._4_4_ * 0.5 * fVar181;
            fVar215 = fVar189 * 1.5 - fVar189 * fVar189 * auVar186._8_4_ * 0.5 * fVar189;
            fVar190 = fVar190 * 1.5 - fVar190 * fVar190 * auVar186._12_4_ * 0.5 * fVar190;
            fVar289 = fVar214 * fVar221 * (float)local_438._0_4_;
            fVar290 = fVar219 * fVar229 * (float)local_438._4_4_;
            fVar292 = fVar142 * fVar231 * (float)uStack_430;
            fVar297 = fVar144 * fVar240 * uStack_430._4_4_;
            fVar189 = -fVar191 * fVar221 * (float)local_438._0_4_;
            fVar191 = -fVar156 * fVar229 * (float)local_438._4_4_;
            fVar214 = -fVar158 * fVar231 * (float)uStack_430;
            fVar219 = -fVar174 * fVar240 * uStack_430._4_4_;
            fVar247 = fVar221 * 0.0 * (float)local_438._0_4_;
            fVar234 = fVar229 * 0.0 * (float)local_438._4_4_;
            fVar258 = fVar231 * 0.0 * (float)uStack_430;
            fVar271 = fVar240 * 0.0 * uStack_430._4_4_;
            local_348 = fVar175 + fVar247;
            fStack_344 = fVar178 + fVar234;
            fStack_340 = fVar180 + fVar258;
            fStack_33c = fVar222 + fVar271;
            fVar142 = fVar246 * fVar213 * auVar302._0_4_;
            fVar144 = fVar291 * fVar181 * auVar302._4_4_;
            fVar145 = fVar238 * fVar215 * auVar302._8_4_;
            fVar159 = fVar263 * fVar190 * auVar302._12_4_;
            fVar273 = fVar300 + fVar142;
            fVar275 = fVar177 + fVar144;
            fVar277 = fVar179 + fVar145;
            fVar287 = fVar298 + fVar159;
            fVar156 = -fVar264 * fVar213 * auVar302._0_4_;
            fVar158 = -fVar272 * fVar181 * auVar302._4_4_;
            fVar174 = -fVar274 * fVar215 * auVar302._8_4_;
            fVar176 = -fVar299 * fVar190 * auVar302._12_4_;
            fVar299 = fVar250 + fVar156;
            fVar264 = fVar257 + fVar158;
            fVar272 = fVar260 + fVar174;
            fVar274 = fVar262 + fVar176;
            fVar221 = fVar213 * 0.0 * auVar302._0_4_;
            fVar229 = fVar181 * 0.0 * auVar302._4_4_;
            fVar231 = fVar215 * 0.0 * auVar302._8_4_;
            fVar240 = fVar190 * 0.0 * auVar302._12_4_;
            fVar246 = local_178 - fVar289;
            fVar291 = fStack_174 - fVar290;
            fVar238 = fStack_170 - fVar292;
            fVar263 = fStack_16c - fVar297;
            fVar276 = fVar108 + fVar221;
            fVar278 = fVar110 + fVar229;
            fVar288 = fVar111 + fVar231;
            fVar74 = fVar113 + fVar240;
            fVar181 = local_268 - fVar189;
            fVar190 = fStack_264 - fVar191;
            fVar213 = fStack_260 - fVar214;
            fVar215 = fStack_25c - fVar219;
            fVar175 = fVar175 - fVar247;
            fVar178 = fVar178 - fVar234;
            fVar180 = fVar180 - fVar258;
            fVar222 = fVar222 - fVar271;
            uVar67 = -(uint)(0.0 < (fVar181 * (fVar276 - fVar175) - fVar175 * (fVar299 - fVar181)) *
                                   0.0 + (fVar175 * (fVar273 - fVar246) -
                                         (fVar276 - fVar175) * fVar246) * 0.0 +
                                         ((fVar299 - fVar181) * fVar246 -
                                         (fVar273 - fVar246) * fVar181));
            uVar69 = -(uint)(0.0 < (fVar190 * (fVar278 - fVar178) - fVar178 * (fVar264 - fVar190)) *
                                   0.0 + (fVar178 * (fVar275 - fVar291) -
                                         (fVar278 - fVar178) * fVar291) * 0.0 +
                                         ((fVar264 - fVar190) * fVar291 -
                                         (fVar275 - fVar291) * fVar190));
            uVar70 = -(uint)(0.0 < (fVar213 * (fVar288 - fVar180) - fVar180 * (fVar272 - fVar213)) *
                                   0.0 + (fVar180 * (fVar277 - fVar238) -
                                         (fVar288 - fVar180) * fVar238) * 0.0 +
                                         ((fVar272 - fVar213) * fVar238 -
                                         (fVar277 - fVar238) * fVar213));
            uVar71 = -(uint)(0.0 < (fVar215 * (fVar74 - fVar222) - fVar222 * (fVar274 - fVar215)) *
                                   0.0 + (fVar222 * (fVar287 - fVar263) -
                                         (fVar74 - fVar222) * fVar263) * 0.0 +
                                         ((fVar274 - fVar215) * fVar263 -
                                         (fVar287 - fVar263) * fVar215));
            local_428._0_4_ =
                 (uint)(fVar300 - fVar142) & uVar67 | ~uVar67 & (uint)(local_178 + fVar289);
            local_428._4_4_ =
                 (uint)(fVar177 - fVar144) & uVar69 | ~uVar69 & (uint)(fStack_174 + fVar290);
            uStack_420._0_4_ =
                 (float)((uint)(fVar179 - fVar145) & uVar70 | ~uVar70 & (uint)(fStack_170 + fVar292)
                        );
            uStack_420._4_4_ =
                 (float)((uint)(fVar298 - fVar159) & uVar71 | ~uVar71 & (uint)(fStack_16c + fVar297)
                        );
            fVar142 = (float)((uint)(fVar250 - fVar156) & uVar67 |
                             ~uVar67 & (uint)(local_268 + fVar189));
            fVar144 = (float)((uint)(fVar257 - fVar158) & uVar69 |
                             ~uVar69 & (uint)(fStack_264 + fVar191));
            fVar145 = (float)((uint)(fVar260 - fVar174) & uVar70 |
                             ~uVar70 & (uint)(fStack_260 + fVar214));
            fVar262 = (float)((uint)(fVar262 - fVar176) & uVar71 |
                             ~uVar71 & (uint)(fStack_25c + fVar219));
            fVar289 = (float)((uint)(fVar108 - fVar221) & uVar67 | ~uVar67 & (uint)local_348);
            fVar290 = (float)((uint)(fVar110 - fVar229) & uVar69 | ~uVar69 & (uint)fStack_344);
            fVar292 = (float)((uint)(fVar111 - fVar231) & uVar70 | ~uVar70 & (uint)fStack_340);
            fVar297 = (float)((uint)(fVar113 - fVar240) & uVar71 | ~uVar71 & (uint)fStack_33c);
            fVar247 = (float)((uint)fVar246 & uVar67 | ~uVar67 & (uint)fVar273);
            fVar234 = (float)((uint)fVar291 & uVar69 | ~uVar69 & (uint)fVar275);
            fVar258 = (float)((uint)fVar238 & uVar70 | ~uVar70 & (uint)fVar277);
            fVar271 = (float)((uint)fVar263 & uVar71 | ~uVar71 & (uint)fVar287);
            fVar189 = (float)((uint)fVar181 & uVar67 | ~uVar67 & (uint)fVar299);
            fVar191 = (float)((uint)fVar190 & uVar69 | ~uVar69 & (uint)fVar264);
            fVar214 = (float)((uint)fVar213 & uVar70 | ~uVar70 & (uint)fVar272);
            fVar219 = (float)((uint)fVar215 & uVar71 | ~uVar71 & (uint)fVar274);
            fVar221 = (float)((uint)fVar175 & uVar67 | ~uVar67 & (uint)fVar276);
            fVar229 = (float)((uint)fVar178 & uVar69 | ~uVar69 & (uint)fVar278);
            fVar231 = (float)((uint)fVar180 & uVar70 | ~uVar70 & (uint)fVar288);
            fVar240 = (float)((uint)fVar222 & uVar71 | ~uVar71 & (uint)fVar74);
            fVar246 = (float)((uint)fVar273 & uVar67 | ~uVar67 & (uint)fVar246) -
                      (float)local_428._0_4_;
            fVar291 = (float)((uint)fVar275 & uVar69 | ~uVar69 & (uint)fVar291) -
                      (float)local_428._4_4_;
            fVar238 = (float)((uint)fVar277 & uVar70 | ~uVar70 & (uint)fVar238) - (float)uStack_420;
            fVar263 = (float)((uint)fVar287 & uVar71 | ~uVar71 & (uint)fVar263) - uStack_420._4_4_;
            fVar273 = (float)((uint)fVar299 & uVar67 | ~uVar67 & (uint)fVar181) - fVar142;
            fVar275 = (float)((uint)fVar264 & uVar69 | ~uVar69 & (uint)fVar190) - fVar144;
            fVar277 = (float)((uint)fVar272 & uVar70 | ~uVar70 & (uint)fVar213) - fVar145;
            fVar287 = (float)((uint)fVar274 & uVar71 | ~uVar71 & (uint)fVar215) - fVar262;
            fVar299 = (float)((uint)fVar276 & uVar67 | ~uVar67 & (uint)fVar175) - fVar289;
            fVar300 = (float)((uint)fVar278 & uVar69 | ~uVar69 & (uint)fVar178) - fVar290;
            fVar177 = (float)((uint)fVar288 & uVar70 | ~uVar70 & (uint)fVar180) - fVar292;
            fVar179 = (float)((uint)fVar74 & uVar71 | ~uVar71 & (uint)fVar222) - fVar297;
            fVar264 = (float)local_428._0_4_ - fVar247;
            fVar272 = (float)local_428._4_4_ - fVar234;
            fVar274 = (float)uStack_420 - fVar258;
            fVar276 = uStack_420._4_4_ - fVar271;
            fVar156 = fVar142 - fVar189;
            fVar158 = fVar144 - fVar191;
            fVar174 = fVar145 - fVar214;
            fVar176 = fVar262 - fVar219;
            fVar181 = fVar289 - fVar221;
            fVar190 = fVar290 - fVar229;
            fVar213 = fVar292 - fVar231;
            fVar215 = fVar297 - fVar240;
            fVar298 = (fVar142 * fVar299 - fVar289 * fVar273) * 0.0 +
                      (fVar289 * fVar246 - (float)local_428._0_4_ * fVar299) * 0.0 +
                      ((float)local_428._0_4_ * fVar273 - fVar142 * fVar246);
            fVar250 = (fVar144 * fVar300 - fVar290 * fVar275) * 0.0 +
                      (fVar290 * fVar291 - (float)local_428._4_4_ * fVar300) * 0.0 +
                      ((float)local_428._4_4_ * fVar275 - fVar144 * fVar291);
            auVar169._4_4_ = fVar250;
            auVar169._0_4_ = fVar298;
            fVar257 = (fVar145 * fVar177 - fVar292 * fVar277) * 0.0 +
                      (fVar292 * fVar238 - (float)uStack_420 * fVar177) * 0.0 +
                      ((float)uStack_420 * fVar277 - fVar145 * fVar238);
            fVar260 = (fVar262 * fVar179 - fVar297 * fVar287) * 0.0 +
                      (fVar297 * fVar263 - uStack_420._4_4_ * fVar179) * 0.0 +
                      (uStack_420._4_4_ * fVar287 - fVar262 * fVar263);
            auVar303._0_4_ =
                 (fVar189 * fVar181 - fVar221 * fVar156) * 0.0 +
                 (fVar221 * fVar264 - fVar247 * fVar181) * 0.0 +
                 (fVar247 * fVar156 - fVar189 * fVar264);
            auVar303._4_4_ =
                 (fVar191 * fVar190 - fVar229 * fVar158) * 0.0 +
                 (fVar229 * fVar272 - fVar234 * fVar190) * 0.0 +
                 (fVar234 * fVar158 - fVar191 * fVar272);
            auVar303._8_4_ =
                 (fVar214 * fVar213 - fVar231 * fVar174) * 0.0 +
                 (fVar231 * fVar274 - fVar258 * fVar213) * 0.0 +
                 (fVar258 * fVar174 - fVar214 * fVar274);
            auVar303._12_4_ =
                 (fVar219 * fVar215 - fVar240 * fVar176) * 0.0 +
                 (fVar240 * fVar276 - fVar271 * fVar215) * 0.0 +
                 (fVar271 * fVar176 - fVar219 * fVar276);
            auVar169._8_4_ = fVar257;
            auVar169._12_4_ = fVar260;
            auVar76 = maxps(auVar169,auVar303);
            bVar49 = auVar76._0_4_ <= 0.0 && bVar49;
            auVar170._0_4_ = -(uint)bVar49;
            bVar50 = auVar76._4_4_ <= 0.0 && bVar50;
            auVar170._4_4_ = -(uint)bVar50;
            bVar51 = auVar76._8_4_ <= 0.0 && bVar51;
            auVar170._8_4_ = -(uint)bVar51;
            bVar52 = auVar76._12_4_ <= 0.0 && bVar52;
            auVar170._12_4_ = -(uint)bVar52;
            iVar53 = movmskps((int)(bezier_basis1 + lVar23),auVar170);
            if (iVar53 == 0) {
LAB_00c078c9:
              auVar152._8_8_ = uStack_2a0;
              auVar152._0_8_ = local_2a8;
            }
            else {
              fVar189 = (ray->super_RayK<1>).tfar;
              fVar214 = fVar156 * fVar299 - fVar181 * fVar273;
              fVar219 = fVar158 * fVar300 - fVar190 * fVar275;
              fVar221 = fVar174 * fVar177 - fVar213 * fVar277;
              fVar229 = fVar176 * fVar179 - fVar215 * fVar287;
              fVar181 = fVar181 * fVar246 - fVar299 * fVar264;
              fVar190 = fVar190 * fVar291 - fVar300 * fVar272;
              fVar191 = fVar213 * fVar238 - fVar177 * fVar274;
              fVar213 = fVar215 * fVar263 - fVar179 * fVar276;
              fVar215 = fVar264 * fVar273 - fVar156 * fVar246;
              fVar231 = fVar272 * fVar275 - fVar158 * fVar291;
              fVar240 = fVar274 * fVar277 - fVar174 * fVar238;
              fVar246 = fVar276 * fVar287 - fVar176 * fVar263;
              auVar151._0_4_ = fVar181 * 0.0 + fVar215;
              auVar151._4_4_ = fVar190 * 0.0 + fVar231;
              auVar151._8_4_ = fVar191 * 0.0 + fVar240;
              auVar151._12_4_ = fVar213 * 0.0 + fVar246;
              auVar218._0_4_ = fVar214 * 0.0 + auVar151._0_4_;
              auVar218._4_4_ = fVar219 * 0.0 + auVar151._4_4_;
              auVar218._8_4_ = fVar221 * 0.0 + auVar151._8_4_;
              auVar218._12_4_ = fVar229 * 0.0 + auVar151._12_4_;
              auVar76 = rcpps(auVar151,auVar218);
              fVar156 = auVar76._0_4_;
              fVar158 = auVar76._4_4_;
              fVar174 = auVar76._8_4_;
              fVar176 = auVar76._12_4_;
              fVar156 = (1.0 - auVar218._0_4_ * fVar156) * fVar156 + fVar156;
              fVar158 = (1.0 - auVar218._4_4_ * fVar158) * fVar158 + fVar158;
              fVar174 = (1.0 - auVar218._8_4_ * fVar174) * fVar174 + fVar174;
              fVar176 = (1.0 - auVar218._12_4_ * fVar176) * fVar176 + fVar176;
              fVar181 = (fVar289 * fVar215 + fVar142 * fVar181 + (float)local_428._0_4_ * fVar214) *
                        fVar156;
              fVar190 = (fVar290 * fVar231 + fVar144 * fVar190 + (float)local_428._4_4_ * fVar219) *
                        fVar158;
              fVar191 = (fVar292 * fVar240 + fVar145 * fVar191 + (float)uStack_420 * fVar221) *
                        fVar174;
              fVar213 = (fVar297 * fVar246 + fVar262 * fVar213 + uStack_420._4_4_ * fVar229) *
                        fVar176;
              bVar49 = (local_298 <= fVar181 && fVar181 <= fVar189) && bVar49;
              auVar187._0_4_ = -(uint)bVar49;
              bVar50 = (fStack_294 <= fVar190 && fVar190 <= fVar189) && bVar50;
              auVar187._4_4_ = -(uint)bVar50;
              bVar51 = (fStack_290 <= fVar191 && fVar191 <= fVar189) && bVar51;
              auVar187._8_4_ = -(uint)bVar51;
              bVar52 = (fStack_28c <= fVar213 && fVar213 <= fVar189) && bVar52;
              auVar187._12_4_ = -(uint)bVar52;
              iVar53 = movmskps(iVar53,auVar187);
              if (iVar53 == 0) goto LAB_00c078c9;
              auVar188._0_8_ =
                   CONCAT44(-(uint)(auVar218._4_4_ != 0.0 && bVar50),
                            -(uint)(auVar218._0_4_ != 0.0 && bVar49));
              auVar188._8_4_ = -(uint)(auVar218._8_4_ != 0.0 && bVar51);
              auVar188._12_4_ = -(uint)(auVar218._12_4_ != 0.0 && bVar52);
              iVar53 = movmskps(iVar53,auVar188);
              auVar152._8_8_ = uStack_2a0;
              auVar152._0_8_ = local_2a8;
              if (iVar53 != 0) {
                fVar298 = fVar298 * fVar156;
                fVar250 = fVar250 * fVar158;
                fVar257 = fVar257 * fVar174;
                fVar260 = fVar260 * fVar176;
                local_368 = (float)((uint)(1.0 - fVar298) & uVar67 | ~uVar67 & (uint)fVar298);
                fStack_364 = (float)((uint)(1.0 - fVar250) & uVar69 | ~uVar69 & (uint)fVar250);
                fStack_360 = (float)((uint)(1.0 - fVar257) & uVar70 | ~uVar70 & (uint)fVar257);
                fStack_35c = (float)((uint)(1.0 - fVar260) & uVar71 | ~uVar71 & (uint)fVar260);
                local_1b8 = (float)(~uVar67 & (uint)(auVar303._0_4_ * fVar156) |
                                   (uint)(1.0 - auVar303._0_4_ * fVar156) & uVar67);
                fStack_1b4 = (float)(~uVar69 & (uint)(auVar303._4_4_ * fVar158) |
                                    (uint)(1.0 - auVar303._4_4_ * fVar158) & uVar69);
                fStack_1b0 = (float)(~uVar70 & (uint)(auVar303._8_4_ * fVar174) |
                                    (uint)(1.0 - auVar303._8_4_ * fVar174) & uVar70);
                fStack_1ac = (float)(~uVar71 & (uint)(auVar303._12_4_ * fVar176) |
                                    (uint)(1.0 - auVar303._12_4_ * fVar176) & uVar71);
                auVar152._8_4_ = auVar188._8_4_;
                auVar152._0_8_ = auVar188._0_8_;
                auVar152._12_4_ = auVar188._12_4_;
                local_378 = fVar181;
                fStack_374 = fVar190;
                fStack_370 = fVar191;
                fStack_36c = fVar213;
              }
            }
            iVar53 = movmskps(iVar53,auVar152);
            fVar181 = local_368;
            fVar229 = fStack_364;
            fVar231 = fStack_360;
            fVar240 = fStack_35c;
            fVar258 = local_378;
            fVar263 = fStack_374;
            fVar271 = fStack_370;
            fVar273 = fStack_36c;
            if (iVar53 != 0) {
              fVar158 = (auVar302._0_4_ - (float)local_438._0_4_) * local_368 +
                        (float)local_438._0_4_;
              fVar174 = (auVar302._4_4_ - (float)local_438._4_4_) * fStack_364 +
                        (float)local_438._4_4_;
              fVar176 = (auVar302._8_4_ - (float)uStack_430) * fStack_360 + (float)uStack_430;
              fVar189 = (auVar302._12_4_ - uStack_430._4_4_) * fStack_35c + uStack_430._4_4_;
              fVar156 = local_2e0->depth_scale;
              auVar102._0_4_ = -(uint)(fVar156 * (fVar158 + fVar158) < local_378) & auVar152._0_4_;
              auVar102._4_4_ = -(uint)(fVar156 * (fVar174 + fVar174) < fStack_374) & auVar152._4_4_;
              auVar102._8_4_ = -(uint)(fVar156 * (fVar176 + fVar176) < fStack_370) & auVar152._8_4_;
              auVar102._12_4_ =
                   -(uint)(fVar156 * (fVar189 + fVar189) < fStack_36c) & auVar152._12_4_;
              iVar53 = movmskps((int)local_2e0,auVar102);
              if (iVar53 != 0) {
                local_1b8 = local_1b8 + local_1b8 + -1.0;
                fStack_1b4 = fStack_1b4 + fStack_1b4 + -1.0;
                fStack_1b0 = fStack_1b0 + fStack_1b0 + -1.0;
                fStack_1ac = fStack_1ac + fStack_1ac + -1.0;
                local_148 = local_368;
                fStack_144 = fStack_364;
                fStack_140 = fStack_360;
                fStack_13c = fStack_35c;
                local_138 = local_1b8;
                fStack_134 = fStack_1b4;
                fStack_130 = fStack_1b0;
                fStack_12c = fStack_1ac;
                local_128 = local_378;
                fStack_124 = fStack_374;
                fStack_120 = fStack_370;
                fStack_11c = fStack_36c;
                local_118 = uVar68;
                local_114 = iVar18;
                local_108 = CONCAT44(fStack_304,local_308);
                uStack_100 = CONCAT44(fStack_2fc,fStack_300);
                local_f8 = CONCAT44(fStack_1e4,local_1e8);
                uStack_f0 = CONCAT44(fStack_1dc,fStack_1e0);
                local_e8 = CONCAT44(fStack_1f4,local_1f8);
                uStack_e0 = CONCAT44(fStack_1ec,fStack_1f0);
                local_d8 = CONCAT44(fStack_1d4,local_1d8);
                uStack_d0 = CONCAT44(fStack_1cc,fStack_1d0);
                local_c8 = auVar102;
                auVar63 = (undefined1  [8])(context->scene->geometries).items[(long)local_3d0].ptr;
                uVar67 = (ray->super_RayK<1>).mask;
                pRVar60 = local_3d0;
                if ((((Geometry *)auVar63)->mask & uVar67) != 0) {
                  local_2f8 = auVar102;
                  fVar156 = (float)(int)uVar68;
                  local_b8[0] = (fVar156 + local_368 + 0.0) * (float)local_208._0_4_;
                  local_b8[1] = (fVar156 + fStack_364 + 1.0) * (float)local_208._4_4_;
                  local_b8[2] = (fVar156 + fStack_360 + 2.0) * fStack_200;
                  local_b8[3] = (fVar156 + fStack_35c + 3.0) * fStack_1fc;
                  local_a8 = CONCAT44(fStack_1b4,local_1b8);
                  uStack_a0 = CONCAT44(fStack_1ac,fStack_1b0);
                  local_98[0] = local_378;
                  local_98[1] = fStack_374;
                  local_98[2] = fStack_370;
                  local_98[3] = fStack_36c;
                  auVar132._0_4_ = auVar102._0_4_ & (uint)local_378;
                  auVar132._4_4_ = auVar102._4_4_ & (uint)fStack_374;
                  auVar132._8_4_ = auVar102._8_4_ & (uint)fStack_370;
                  auVar132._12_4_ = auVar102._12_4_ & (uint)fStack_36c;
                  auVar153._0_8_ = CONCAT44(~auVar102._4_4_,~auVar102._0_4_) & 0x7f8000007f800000;
                  auVar153._8_4_ = ~auVar102._8_4_ & 0x7f800000;
                  auVar153._12_4_ = ~auVar102._12_4_ & 0x7f800000;
                  auVar153 = auVar153 | auVar132;
                  auVar171._4_4_ = auVar153._0_4_;
                  auVar171._0_4_ = auVar153._4_4_;
                  auVar171._8_4_ = auVar153._12_4_;
                  auVar171._12_4_ = auVar153._8_4_;
                  auVar76 = minps(auVar171,auVar153);
                  auVar133._0_8_ = auVar76._8_8_;
                  auVar133._8_4_ = auVar76._0_4_;
                  auVar133._12_4_ = auVar76._4_4_;
                  auVar76 = minps(auVar133,auVar76);
                  auVar134._0_8_ =
                       CONCAT44(-(uint)(auVar76._4_4_ == auVar153._4_4_) & auVar102._4_4_,
                                -(uint)(auVar76._0_4_ == auVar153._0_4_) & auVar102._0_4_);
                  auVar134._8_4_ = -(uint)(auVar76._8_4_ == auVar153._8_4_) & auVar102._8_4_;
                  auVar134._12_4_ = -(uint)(auVar76._12_4_ == auVar153._12_4_) & auVar102._12_4_;
                  iVar53 = movmskps(uVar67,auVar134);
                  if (iVar53 != 0) {
                    auVar102._8_4_ = auVar134._8_4_;
                    auVar102._0_8_ = auVar134._0_8_;
                    auVar102._12_4_ = auVar134._12_4_;
                  }
                  uVar67 = movmskps(iVar53,auVar102);
                  lVar64 = 0;
                  if (uVar67 != 0) {
                    for (; (uVar67 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar63)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar156 = local_b8[lVar64];
                    fVar158 = *(float *)((long)&local_a8 + lVar64 * 4);
                    fVar174 = 1.0 - fVar156;
                    fVar189 = fVar156 * fVar174 + fVar156 * fVar174;
                    fVar176 = fVar174 * fVar174 * -3.0;
                    fVar190 = (fVar174 * fVar174 - fVar189) * 3.0;
                    fVar174 = (fVar189 - fVar156 * fVar156) * 3.0;
                    fVar189 = fVar156 * fVar156 * 3.0;
                    (ray->super_RayK<1>).tfar = local_98[lVar64];
                    *(ulong *)&(ray->Ng).field_0 =
                         CONCAT44(fVar176 * fStack_304 +
                                  fVar190 * fStack_1e4 + fVar174 * fStack_1f4 + fVar189 * fStack_1d4
                                  ,fVar176 * local_308 +
                                   fVar190 * local_1e8 + fVar174 * local_1f8 + fVar189 * local_1d8);
                    (ray->Ng).field_0.field_0.z =
                         fVar176 * fStack_300 +
                         fVar190 * fStack_1e0 + fVar174 * fStack_1f0 + fVar189 * fStack_1d0;
                    ray->u = fVar156;
                    ray->v = fVar158;
                    ray->primID = (uint)local_380;
                    ray->geomID = (uint)local_3d0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    pRVar60 = (RTCIntersectArguments *)context;
                    prim = local_210;
                  }
                  else {
                    uStack_420 = CONCAT44(fStack_1ec,fStack_1f0);
                    local_428 = (undefined1  [8])CONCAT44(fStack_1f4,local_1f8);
                    uStack_430 = CONCAT44(fStack_1cc,fStack_1d0);
                    local_438 = (undefined1  [8])CONCAT44(fStack_1d4,local_1d8);
                    uStack_330 = auVar302._8_8_;
                    local_338 = auVar63;
                    do {
                      local_23c = local_b8[lVar64];
                      local_238 = *(undefined4 *)((long)&local_a8 + lVar64 * 4);
                      fVar156 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = local_98[lVar64];
                      local_2d8.context = context->user;
                      fVar158 = 1.0 - local_23c;
                      fVar176 = local_23c * fVar158 + local_23c * fVar158;
                      fVar174 = fVar158 * fVar158 * -3.0;
                      fVar189 = (fVar158 * fVar158 - fVar176) * 3.0;
                      fVar158 = (fVar176 - local_23c * local_23c) * 3.0;
                      fVar176 = local_23c * local_23c * 3.0;
                      local_248 = CONCAT44(fVar174 * fStack_304 +
                                           fVar189 * fVar248 +
                                           fVar158 * (float)local_428._4_4_ +
                                           fVar176 * (float)local_438._4_4_,
                                           fVar174 * local_308 +
                                           fVar189 * fVar239 +
                                           fVar158 * (float)local_428._0_4_ +
                                           fVar176 * (float)local_438._0_4_);
                      local_240 = fVar174 * fStack_300 +
                                  fVar189 * fVar255 +
                                  fVar158 * (float)uStack_420 + fVar176 * (float)uStack_430;
                      local_234 = (int)local_380;
                      local_230 = (int)local_3d0;
                      local_22c = (local_2d8.context)->instID[0];
                      local_228 = (local_2d8.context)->instPrimID[0];
                      local_44c.m128[0] = -NAN;
                      local_2d8.valid = (int *)&local_44c;
                      pRVar60 = (RTCIntersectArguments *)((Geometry *)auVar63)->userPtr;
                      local_2d8.geometryUserPtr = pRVar60;
                      local_2d8.ray = (RTCRayN *)ray;
                      local_2d8.hit = (RTCHitN *)&local_248;
                      local_2d8.N = 1;
                      if (((Geometry *)auVar63)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c07afb:
                        pRVar60 = context->args;
                        if ((RTCIntersectArguments *)pRVar60->filter != (RTCIntersectArguments *)0x0
                           ) {
                          if ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0) ||
                             (((((Geometry *)auVar63)->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)pRVar60->filter)(&local_2d8);
                            uVar61 = extraout_RDX_00;
                            auVar63 = local_338;
                            uVar304 = local_44c.m128[1];
                            uVar308 = local_44c.m128[2];
                            uVar310 = local_44c.m128[3];
                            fVar220 = fStack_43c;
                            fVar157 = local_3a8;
                            fVar73 = fStack_3a4;
                            fVar107 = fStack_3a0;
                            fVar109 = fStack_39c;
                            fVar181 = local_368;
                            fVar229 = fStack_364;
                            fVar231 = fStack_360;
                            fVar240 = fStack_35c;
                            fVar258 = local_378;
                            fVar263 = fStack_374;
                            fVar271 = fStack_370;
                            fVar273 = fStack_36c;
                            fVar112 = local_398;
                            fVar141 = fStack_394;
                            fVar143 = fStack_390;
                            fVar146 = fStack_38c;
                          }
                          if (*(float *)local_2d8.valid == 0.0) goto LAB_00c07bca;
                        }
                        *(float *)((long)local_2d8.ray + 0x30) = *(float *)local_2d8.hit;
                        *(float *)((long)local_2d8.ray + 0x34) = *(float *)(local_2d8.hit + 4);
                        *(float *)((long)local_2d8.ray + 0x38) = *(float *)(local_2d8.hit + 8);
                        *(float *)((long)local_2d8.ray + 0x3c) = *(float *)(local_2d8.hit + 0xc);
                        *(float *)((long)local_2d8.ray + 0x40) = *(float *)(local_2d8.hit + 0x10);
                        *(float *)((long)local_2d8.ray + 0x44) = *(float *)(local_2d8.hit + 0x14);
                        *(float *)((long)local_2d8.ray + 0x48) = *(float *)(local_2d8.hit + 0x18);
                        uVar61 = (ulong)(uint)*(float *)(local_2d8.hit + 0x1c);
                        *(float *)((long)local_2d8.ray + 0x4c) = *(float *)(local_2d8.hit + 0x1c);
                        pRVar60 = (RTCIntersectArguments *)
                                  (ulong)(uint)*(float *)(local_2d8.hit + 0x20);
                        *(float *)((long)local_2d8.ray + 0x50) = *(float *)(local_2d8.hit + 0x20);
                        paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2d8.ray;
                      }
                      else {
                        (*((Geometry *)auVar63)->intersectionFilterN)(&local_2d8);
                        uVar61 = extraout_RDX;
                        auVar63 = local_338;
                        uVar304 = local_44c.m128[1];
                        uVar308 = local_44c.m128[2];
                        uVar310 = local_44c.m128[3];
                        fVar220 = fStack_43c;
                        fVar157 = local_3a8;
                        fVar73 = fStack_3a4;
                        fVar107 = fStack_3a0;
                        fVar109 = fStack_39c;
                        fVar181 = local_368;
                        fVar229 = fStack_364;
                        fVar231 = fStack_360;
                        fVar240 = fStack_35c;
                        fVar258 = local_378;
                        fVar263 = fStack_374;
                        fVar271 = fStack_370;
                        fVar273 = fStack_36c;
                        fVar112 = local_398;
                        fVar141 = fStack_394;
                        fVar143 = fStack_390;
                        fVar146 = fStack_38c;
                        if (*(float *)local_2d8.valid != 0.0) goto LAB_00c07afb;
LAB_00c07bca:
                        (ray->super_RayK<1>).tfar = fVar156;
                        paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2d8.valid;
                      }
                      *(undefined4 *)(local_2f8 + lVar64 * 4) = 0;
                      fVar156 = (ray->super_RayK<1>).tfar;
                      auVar103._0_4_ = -(uint)(fVar258 <= fVar156) & local_2f8._0_4_;
                      auVar103._4_4_ = -(uint)(fVar263 <= fVar156) & local_2f8._4_4_;
                      auVar103._8_4_ = -(uint)(fVar271 <= fVar156) & local_2f8._8_4_;
                      auVar103._12_4_ = -(uint)(fVar273 <= fVar156) & local_2f8._12_4_;
                      local_2f8 = auVar103;
                      iVar53 = movmskps((int)paVar56,auVar103);
                      if (iVar53 != 0) {
                        auVar135._0_4_ = auVar103._0_4_ & (uint)fVar258;
                        auVar135._4_4_ = auVar103._4_4_ & (uint)fVar263;
                        auVar135._8_4_ = auVar103._8_4_ & (uint)fVar271;
                        auVar135._12_4_ = auVar103._12_4_ & (uint)fVar273;
                        auVar154._0_8_ =
                             CONCAT44(~auVar103._4_4_,~auVar103._0_4_) & 0x7f8000007f800000;
                        auVar154._8_4_ = ~auVar103._8_4_ & 0x7f800000;
                        auVar154._12_4_ = ~auVar103._12_4_ & 0x7f800000;
                        auVar154 = auVar154 | auVar135;
                        auVar172._4_4_ = auVar154._0_4_;
                        auVar172._0_4_ = auVar154._4_4_;
                        auVar172._8_4_ = auVar154._12_4_;
                        auVar172._12_4_ = auVar154._8_4_;
                        auVar76 = minps(auVar172,auVar154);
                        auVar136._0_8_ = auVar76._8_8_;
                        auVar136._8_4_ = auVar76._0_4_;
                        auVar136._12_4_ = auVar76._4_4_;
                        auVar76 = minps(auVar136,auVar76);
                        auVar137._0_8_ =
                             CONCAT44(-(uint)(auVar76._4_4_ == auVar154._4_4_) & auVar103._4_4_,
                                      -(uint)(auVar76._0_4_ == auVar154._0_4_) & auVar103._0_4_);
                        auVar137._8_4_ = -(uint)(auVar76._8_4_ == auVar154._8_4_) & auVar103._8_4_;
                        auVar137._12_4_ =
                             -(uint)(auVar76._12_4_ == auVar154._12_4_) & auVar103._12_4_;
                        iVar57 = movmskps((int)pRVar60,auVar137);
                        if (iVar57 != 0) {
                          auVar103._8_4_ = auVar137._8_4_;
                          auVar103._0_8_ = auVar137._0_8_;
                          auVar103._12_4_ = auVar137._12_4_;
                        }
                        uVar58 = movmskps(iVar57,auVar103);
                        pRVar60 = (RTCIntersectArguments *)
                                  CONCAT44((int)((ulong)pRVar60 >> 0x20),uVar58);
                        lVar64 = 0;
                        if (pRVar60 != (RTCIntersectArguments *)0x0) {
                          for (; ((ulong)pRVar60 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                          }
                        }
                      }
                      prim = local_210;
                    } while ((char)iVar53 != '\0');
                  }
                }
              }
            }
          }
          iVar57 = (int)pRVar60;
          local_378 = fVar258;
          fStack_374 = fVar263;
          fStack_370 = fVar271;
          fStack_36c = fVar273;
          local_368 = fVar181;
          fStack_364 = fVar229;
          fStack_360 = fVar231;
          fStack_35c = fVar240;
          lVar65 = lVar65 + 4;
          fVar181 = local_3c8;
          fVar229 = fStack_3c4;
          fVar231 = fStack_3c0;
          fVar240 = fStack_3bc;
        } while ((int)lVar65 < iVar18);
      }
      fVar157 = (ray->super_RayK<1>).tfar;
      auVar131._4_4_ = -(uint)(fStack_44 <= fVar157);
      auVar131._0_4_ = -(uint)(local_48 <= fVar157);
      auVar131._8_4_ = -(uint)(fStack_40 <= fVar157);
      auVar131._12_4_ = -(uint)(fStack_3c <= fVar157);
      uVar67 = movmskps(iVar57,auVar131);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }